

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  int iVar96;
  float fVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  float fVar142;
  float fVar143;
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  vint4 ai_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  __m128 a;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar200 [16];
  undefined1 auVar209 [32];
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar225;
  float fVar226;
  vfloat4 a0_3;
  undefined1 auVar216 [16];
  float fVar227;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar242;
  vfloat4 b0_2;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  vfloat4 b0_3;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  Primitive *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  float fVar135;
  float fVar141;
  undefined1 auVar254 [32];
  
  PVar5 = prim[1];
  uVar21 = (ulong)(byte)PVar5;
  lVar23 = uVar21 * 0x25;
  fVar97 = *(float *)(prim + lVar23 + 0x12);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar35 = vsubps_avx(auVar35,*(undefined1 (*) [16])(prim + lVar23 + 6));
  auVar60._0_4_ = fVar97 * auVar35._0_4_;
  auVar60._4_4_ = fVar97 * auVar35._4_4_;
  auVar60._8_4_ = fVar97 * auVar35._8_4_;
  auVar60._12_4_ = fVar97 * auVar35._12_4_;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar38._0_4_ = fVar97 * auVar36._0_4_;
  auVar38._4_4_ = fVar97 * auVar36._4_4_;
  auVar38._8_4_ = fVar97 * auVar36._8_4_;
  auVar38._12_4_ = fVar97 * auVar36._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xf + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar21 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1a + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1b + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1c + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar145._4_4_ = auVar38._0_4_;
  auVar145._0_4_ = auVar38._0_4_;
  auVar145._8_4_ = auVar38._0_4_;
  auVar145._12_4_ = auVar38._0_4_;
  auVar52 = vshufps_avx(auVar38,auVar38,0x55);
  auVar53 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar97 = auVar53._0_4_;
  auVar58._0_4_ = fVar97 * auVar44._0_4_;
  fVar230 = auVar53._4_4_;
  auVar58._4_4_ = fVar230 * auVar44._4_4_;
  fVar215 = auVar53._8_4_;
  auVar58._8_4_ = fVar215 * auVar44._8_4_;
  fVar225 = auVar53._12_4_;
  auVar58._12_4_ = fVar225 * auVar44._12_4_;
  auVar46._0_4_ = auVar47._0_4_ * fVar97;
  auVar46._4_4_ = auVar47._4_4_ * fVar230;
  auVar46._8_4_ = auVar47._8_4_ * fVar215;
  auVar46._12_4_ = auVar47._12_4_ * fVar225;
  auVar39._0_4_ = auVar51._0_4_ * fVar97;
  auVar39._4_4_ = auVar51._4_4_ * fVar230;
  auVar39._8_4_ = auVar51._8_4_ * fVar215;
  auVar39._12_4_ = auVar51._12_4_ * fVar225;
  auVar53 = vfmadd231ps_fma(auVar58,auVar52,auVar36);
  auVar54 = vfmadd231ps_fma(auVar46,auVar52,auVar50);
  auVar52 = vfmadd231ps_fma(auVar39,auVar49,auVar52);
  auVar55 = vfmadd231ps_fma(auVar53,auVar145,auVar35);
  auVar54 = vfmadd231ps_fma(auVar54,auVar145,auVar43);
  auVar56 = vfmadd231ps_fma(auVar52,auVar48,auVar145);
  auVar247._4_4_ = auVar60._0_4_;
  auVar247._0_4_ = auVar60._0_4_;
  auVar247._8_4_ = auVar60._0_4_;
  auVar247._12_4_ = auVar60._0_4_;
  auVar52 = vshufps_avx(auVar60,auVar60,0x55);
  auVar53 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar97 = auVar53._0_4_;
  auVar146._0_4_ = fVar97 * auVar44._0_4_;
  fVar230 = auVar53._4_4_;
  auVar146._4_4_ = fVar230 * auVar44._4_4_;
  fVar215 = auVar53._8_4_;
  auVar146._8_4_ = fVar215 * auVar44._8_4_;
  fVar225 = auVar53._12_4_;
  auVar146._12_4_ = fVar225 * auVar44._12_4_;
  auVar62._0_4_ = auVar47._0_4_ * fVar97;
  auVar62._4_4_ = auVar47._4_4_ * fVar230;
  auVar62._8_4_ = auVar47._8_4_ * fVar215;
  auVar62._12_4_ = auVar47._12_4_ * fVar225;
  auVar61._0_4_ = auVar51._0_4_ * fVar97;
  auVar61._4_4_ = auVar51._4_4_ * fVar230;
  auVar61._8_4_ = auVar51._8_4_ * fVar215;
  auVar61._12_4_ = auVar51._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar146,auVar52,auVar36);
  auVar44 = vfmadd231ps_fma(auVar62,auVar52,auVar50);
  auVar50 = vfmadd231ps_fma(auVar61,auVar52,auVar49);
  auVar37 = vfmadd231ps_fma(auVar36,auVar247,auVar35);
  auVar38 = vfmadd231ps_fma(auVar44,auVar247,auVar43);
  auVar83._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar268 = ZEXT1664(auVar35);
  auVar39 = vfmadd231ps_fma(auVar50,auVar247,auVar48);
  auVar36 = vandps_avx512vl(auVar55,auVar35);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar36,auVar178,1);
  bVar27 = (bool)((byte)uVar33 & 1);
  auVar40._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar55._0_4_;
  bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar55._4_4_;
  bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar55._8_4_;
  bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar55._12_4_;
  auVar36 = vandps_avx512vl(auVar54,auVar35);
  uVar33 = vcmpps_avx512vl(auVar36,auVar178,1);
  bVar27 = (bool)((byte)uVar33 & 1);
  auVar41._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar54._0_4_;
  bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar54._4_4_;
  bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar54._8_4_;
  bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar54._12_4_;
  auVar35 = vandps_avx512vl(auVar56,auVar35);
  uVar33 = vcmpps_avx512vl(auVar35,auVar178,1);
  bVar27 = (bool)((byte)uVar33 & 1);
  auVar42._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar56._0_4_;
  bVar27 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar56._4_4_;
  bVar27 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar56._8_4_;
  bVar27 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar56._12_4_;
  auVar36 = vrcp14ps_avx512vl(auVar40);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar35 = vfnmadd213ps_fma(auVar40,auVar36,auVar179);
  auVar55 = vfmadd132ps_fma(auVar35,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar41);
  auVar35 = vfnmadd213ps_fma(auVar41,auVar36,auVar179);
  auVar56 = vfmadd132ps_fma(auVar35,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar42);
  auVar35 = vfnmadd213ps_fma(auVar42,auVar36,auVar179);
  auVar57 = vfmadd132ps_fma(auVar35,auVar36,auVar36);
  fVar97 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
           *(float *)(prim + lVar23 + 0x1a);
  auVar165._4_4_ = fVar97;
  auVar165._0_4_ = fVar97;
  auVar165._8_4_ = fVar97;
  auVar165._12_4_ = fVar97;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar21 * 0xb + 6);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar43 = vsubps_avx(auVar36,auVar35);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar36 = vpmovsxwd_avx(auVar44);
  auVar44 = vfmadd213ps_fma(auVar43,auVar165,auVar35);
  auVar35 = vcvtdq2ps_avx(auVar36);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar21 * 0xd + 6);
  auVar36 = vpmovsxwd_avx(auVar43);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar35);
  auVar43 = vfmadd213ps_fma(auVar36,auVar165,auVar35);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar21 * 0x12 + 6);
  auVar35 = vpmovsxwd_avx(auVar50);
  auVar35 = vcvtdq2ps_avx(auVar35);
  uVar33 = (ulong)(uint)((int)(uVar21 * 5) << 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar21 * 2 + uVar33 + 6);
  auVar36 = vpmovsxwd_avx(auVar47);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar35);
  auVar50 = vfmadd213ps_fma(auVar36,auVar165,auVar35);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar35 = vpmovsxwd_avx(auVar48);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar21 * 0x18 + 6);
  auVar36 = vpmovsxwd_avx(auVar49);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar35);
  auVar47 = vfmadd213ps_fma(auVar36,auVar165,auVar35);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar21 * 0x1d + 6);
  auVar35 = vpmovsxwd_avx(auVar51);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar21 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar36 = vpmovsxwd_avx(auVar52);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar35);
  auVar48 = vfmadd213ps_fma(auVar36,auVar165,auVar35);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar21) + 6);
  auVar35 = vpmovsxwd_avx(auVar53);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar21 * 0x23 + 6);
  auVar36 = vpmovsxwd_avx(auVar54);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar35);
  auVar36 = vfmadd213ps_fma(auVar36,auVar165,auVar35);
  auVar35 = vsubps_avx(auVar44,auVar37);
  auVar166._0_4_ = auVar55._0_4_ * auVar35._0_4_;
  auVar166._4_4_ = auVar55._4_4_ * auVar35._4_4_;
  auVar166._8_4_ = auVar55._8_4_ * auVar35._8_4_;
  auVar166._12_4_ = auVar55._12_4_ * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar43,auVar37);
  auVar59._0_4_ = auVar55._0_4_ * auVar35._0_4_;
  auVar59._4_4_ = auVar55._4_4_ * auVar35._4_4_;
  auVar59._8_4_ = auVar55._8_4_ * auVar35._8_4_;
  auVar59._12_4_ = auVar55._12_4_ * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar50,auVar38);
  auVar147._0_4_ = auVar56._0_4_ * auVar35._0_4_;
  auVar147._4_4_ = auVar56._4_4_ * auVar35._4_4_;
  auVar147._8_4_ = auVar56._8_4_ * auVar35._8_4_;
  auVar147._12_4_ = auVar56._12_4_ * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar47,auVar38);
  auVar63._0_4_ = auVar56._0_4_ * auVar35._0_4_;
  auVar63._4_4_ = auVar56._4_4_ * auVar35._4_4_;
  auVar63._8_4_ = auVar56._8_4_ * auVar35._8_4_;
  auVar63._12_4_ = auVar56._12_4_ * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar48,auVar39);
  auVar136._0_4_ = auVar57._0_4_ * auVar35._0_4_;
  auVar136._4_4_ = auVar57._4_4_ * auVar35._4_4_;
  auVar136._8_4_ = auVar57._8_4_ * auVar35._8_4_;
  auVar136._12_4_ = auVar57._12_4_ * auVar35._12_4_;
  auVar35 = vsubps_avx(auVar36,auVar39);
  auVar45._0_4_ = auVar57._0_4_ * auVar35._0_4_;
  auVar45._4_4_ = auVar57._4_4_ * auVar35._4_4_;
  auVar45._8_4_ = auVar57._8_4_ * auVar35._8_4_;
  auVar45._12_4_ = auVar57._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar166,auVar59);
  auVar36 = vpminsd_avx(auVar147,auVar63);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar136,auVar45);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar55._4_4_ = uVar98;
  auVar55._0_4_ = uVar98;
  auVar55._8_4_ = uVar98;
  auVar55._12_4_ = uVar98;
  auVar36 = vmaxps_avx512vl(auVar36,auVar55);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar56._8_4_ = 0x3f7ffffa;
  auVar56._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar56._12_4_ = 0x3f7ffffa;
  local_288 = vmulps_avx512vl(auVar35,auVar56);
  auVar35 = vpmaxsd_avx(auVar166,auVar59);
  auVar36 = vpmaxsd_avx(auVar147,auVar63);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar136,auVar45);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar57._4_4_ = uVar98;
  auVar57._0_4_ = uVar98;
  auVar57._8_4_ = uVar98;
  auVar57._12_4_ = uVar98;
  auVar36 = vminps_avx512vl(auVar36,auVar57);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar37._8_4_ = 0x3f800003;
  auVar37._0_8_ = 0x3f8000033f800003;
  auVar37._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar37);
  auVar36 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_288,auVar35,2);
  uVar33 = vpcmpgtd_avx512vl(auVar36,_DAT_01f7fcf0);
  uVar33 = ((byte)uVar13 & 0xf) & uVar33;
  if ((char)uVar33 == '\0') {
    return false;
  }
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar35 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar263 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar267 = ZEXT1664(auVar35);
  local_360 = prim;
LAB_01b8d9d9:
  lVar23 = 0;
  for (uVar21 = uVar33; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar28 = *(uint *)(local_360 + 2);
  pGVar7 = (context->scene->geometries).items[uVar28].ptr;
  fVar97 = (pGVar7->time_range).lower;
  fVar97 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar97) / ((pGVar7->time_range).upper - fVar97));
  auVar35 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),9);
  auVar36 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar35 = vminss_avx(auVar35,auVar36);
  auVar41 = auVar263._0_16_;
  auVar37 = vmaxss_avx512f(auVar41,auVar35);
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_360 + lVar23 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar25 = (long)(int)auVar37._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar25);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar25);
  auVar35 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar21);
  lVar23 = uVar21 + 1;
  auVar36 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar23);
  lVar1 = uVar21 + 2;
  auVar44 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar21 + 3;
  auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar25);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar25);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar21);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar23);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar25);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar25);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar21);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar23);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  local_298 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar25);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar25);
  auVar55 = *(undefined1 (*) [16])(lVar10 + uVar21 * lVar9);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar23 * lVar9);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar37 = vsubss_avx512f(ZEXT416((uint)fVar97),auVar37);
  auVar79._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar38 = vmulps_avx512vl(auVar43,auVar79._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar79._0_16_);
  auVar39 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar39 = vfmadd213ps_avx512vl(auVar39,auVar36,auVar38);
  auVar39 = vaddps_avx512vl(auVar35,auVar39);
  auVar63 = auVar267._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar36,auVar63);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar35,auVar63);
  auVar40 = vmulps_avx512vl(auVar49,auVar79._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar79._0_16_);
  auVar41 = vxorps_avx512vl(auVar41,auVar41);
  auVar41 = vfmadd213ps_avx512vl(auVar41,auVar47,auVar40);
  auVar42 = vaddps_avx512vl(auVar50,auVar41);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar47,auVar63);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar50,auVar63);
  auVar41 = vxorps_avx512vl(auVar41,auVar41);
  auVar41 = vfmadd213ps_avx512vl(auVar41,auVar44,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar79._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar35,auVar79._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar63);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar63,auVar44);
  auVar36 = vfmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar36);
  auVar45 = vfnmadd231ps_avx512vl(auVar36,auVar79._0_16_,auVar35);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar49);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar47,auVar79._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar35,auVar50,auVar79._0_16_);
  auVar35 = vmulps_avx512vl(auVar49,auVar63);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar63,auVar48);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar79._0_16_,auVar47);
  auVar47 = vfnmadd231ps_avx512vl(auVar35,auVar79._0_16_,auVar50);
  auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar36 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  fVar119 = auVar38._0_4_;
  auVar148._0_4_ = fVar119 * auVar36._0_4_;
  fVar132 = auVar38._4_4_;
  auVar148._4_4_ = fVar132 * auVar36._4_4_;
  fVar133 = auVar38._8_4_;
  auVar148._8_4_ = fVar133 * auVar36._8_4_;
  fVar134 = auVar38._12_4_;
  auVar148._12_4_ = fVar134 * auVar36._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar148,auVar35,auVar42);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar167._0_4_ = fVar119 * auVar36._0_4_;
  auVar167._4_4_ = fVar132 * auVar36._4_4_;
  auVar167._8_4_ = fVar133 * auVar36._8_4_;
  auVar167._12_4_ = fVar134 * auVar36._12_4_;
  auVar35 = vfmsub231ps_avx512vl(auVar167,auVar35,auVar40);
  auVar43 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar36 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar97 = auVar45._0_4_;
  auVar185._0_4_ = auVar36._0_4_ * fVar97;
  fVar230 = auVar45._4_4_;
  auVar185._4_4_ = auVar36._4_4_ * fVar230;
  fVar215 = auVar45._8_4_;
  auVar185._8_4_ = auVar36._8_4_ * fVar215;
  fVar225 = auVar45._12_4_;
  auVar185._12_4_ = auVar36._12_4_ * fVar225;
  auVar36 = vfmsub231ps_fma(auVar185,auVar35,auVar46);
  auVar50 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar186._0_4_ = auVar36._0_4_ * fVar97;
  auVar186._4_4_ = auVar36._4_4_ * fVar230;
  auVar186._8_4_ = auVar36._8_4_ * fVar215;
  auVar186._12_4_ = auVar36._12_4_ * fVar225;
  auVar35 = vfmsub231ps_fma(auVar186,auVar35,auVar47);
  auVar47 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar79._16_16_ = auVar83._16_16_;
  auVar64._4_28_ = auVar79._4_28_;
  auVar64._0_4_ = auVar35._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar48 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  auVar49 = vmulss_avx512f(auVar49,auVar36);
  auVar36 = vmulss_avx512f(auVar49,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  auVar36 = vsubss_avx512f(auVar48,auVar36);
  auVar196._0_4_ = auVar36._0_4_;
  auVar196._4_4_ = auVar196._0_4_;
  auVar196._8_4_ = auVar196._0_4_;
  auVar196._12_4_ = auVar196._0_4_;
  auVar48 = vmulps_avx512vl(auVar44,auVar196);
  auVar36 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar49 = vbroadcastss_avx512vl(auVar35);
  auVar43 = vmulps_avx512vl(auVar49,auVar43);
  fVar226 = auVar36._0_4_;
  auVar149._0_4_ = fVar226 * auVar44._0_4_;
  auVar149._4_4_ = fVar226 * auVar44._4_4_;
  auVar149._8_4_ = fVar226 * auVar44._8_4_;
  auVar149._12_4_ = fVar226 * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar43,auVar149);
  auVar36 = vrcp14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar226 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar50,auVar50,0x7f);
  auVar82._16_16_ = auVar83._16_16_;
  auVar82._0_16_ = auVar79._0_16_;
  auVar65._4_28_ = auVar82._4_28_;
  auVar65._0_4_ = auVar35._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar43 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  fVar135 = auVar36._0_4_;
  fVar141 = auVar43._0_4_ - auVar49._0_4_ * fVar135 * fVar135 * fVar135;
  auVar197._0_4_ = fVar141 * auVar50._0_4_;
  auVar197._4_4_ = fVar141 * auVar50._4_4_;
  auVar197._8_4_ = fVar141 * auVar50._8_4_;
  auVar197._12_4_ = fVar141 * auVar50._12_4_;
  auVar36 = vdpps_avx(auVar50,auVar47,0x7f);
  auVar43 = vbroadcastss_avx512vl(auVar35);
  auVar43 = vmulps_avx512vl(auVar43,auVar47);
  fVar135 = auVar36._0_4_;
  auVar99._0_4_ = fVar135 * auVar50._0_4_;
  auVar99._4_4_ = fVar135 * auVar50._4_4_;
  auVar99._8_4_ = fVar135 * auVar50._8_4_;
  auVar99._12_4_ = fVar135 * auVar50._12_4_;
  auVar36 = vsubps_avx(auVar43,auVar99);
  auVar43 = vrcp14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar43,ZEXT416(0x40000000));
  fVar135 = auVar43._0_4_ * auVar35._0_4_;
  auVar43 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar50 = vmulps_avx512vl(auVar43,auVar48);
  auVar47 = vsubps_avx512vl(auVar39,auVar50);
  auVar35 = vshufps_avx(auVar38,auVar38,0xff);
  auVar35 = vmulps_avx512vl(auVar35,auVar48);
  auVar137._0_4_ = auVar35._0_4_ + auVar43._0_4_ * auVar196._0_4_ * fVar226 * auVar44._0_4_;
  auVar137._4_4_ = auVar35._4_4_ + auVar43._4_4_ * auVar196._0_4_ * fVar226 * auVar44._4_4_;
  auVar137._8_4_ = auVar35._8_4_ + auVar43._8_4_ * auVar196._0_4_ * fVar226 * auVar44._8_4_;
  auVar137._12_4_ = auVar35._12_4_ + auVar43._12_4_ * auVar196._0_4_ * fVar226 * auVar44._12_4_;
  auVar35 = vsubps_avx(auVar38,auVar137);
  auVar48 = vaddps_avx512vl(auVar39,auVar50);
  auVar44 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar232._0_4_ = auVar197._0_4_ * auVar44._0_4_;
  auVar232._4_4_ = auVar197._4_4_ * auVar44._4_4_;
  auVar232._8_4_ = auVar197._8_4_ * auVar44._8_4_;
  auVar232._12_4_ = auVar197._12_4_ * auVar44._12_4_;
  auVar49 = vsubps_avx512vl(auVar41,auVar232);
  auVar43 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar50 = vmulps_avx512vl(auVar43,auVar197);
  auVar150._0_4_ = auVar50._0_4_ + auVar44._0_4_ * fVar141 * auVar36._0_4_ * fVar135;
  auVar150._4_4_ = auVar50._4_4_ + auVar44._4_4_ * fVar141 * auVar36._4_4_ * fVar135;
  auVar150._8_4_ = auVar50._8_4_ + auVar44._8_4_ * fVar141 * auVar36._8_4_ * fVar135;
  auVar150._12_4_ = auVar50._12_4_ + auVar44._12_4_ * fVar141 * auVar36._12_4_ * fVar135;
  auVar36 = vsubps_avx(auVar45,auVar150);
  auVar38 = vaddps_avx512vl(auVar41,auVar232);
  auVar180._0_4_ = auVar47._0_4_ + auVar35._0_4_ * 0.33333334;
  auVar180._4_4_ = auVar47._4_4_ + auVar35._4_4_ * 0.33333334;
  auVar180._8_4_ = auVar47._8_4_ + auVar35._8_4_ * 0.33333334;
  auVar180._12_4_ = auVar47._12_4_ + auVar35._12_4_ * 0.33333334;
  auVar151._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar151._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar151._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar151._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar50 = vsubps_avx(auVar49,auVar151);
  auVar152._0_4_ = (fVar119 + auVar137._0_4_) * 0.33333334;
  auVar152._4_4_ = (fVar132 + auVar137._4_4_) * 0.33333334;
  auVar152._8_4_ = (fVar133 + auVar137._8_4_) * 0.33333334;
  auVar152._12_4_ = (fVar134 + auVar137._12_4_) * 0.33333334;
  auVar39 = vaddps_avx512vl(auVar48,auVar152);
  auVar168._0_4_ = (fVar97 + auVar150._0_4_) * 0.33333334;
  auVar168._4_4_ = (fVar230 + auVar150._4_4_) * 0.33333334;
  auVar168._8_4_ = (fVar215 + auVar150._8_4_) * 0.33333334;
  auVar168._12_4_ = (fVar225 + auVar150._12_4_) * 0.33333334;
  auVar40 = vsubps_avx512vl(auVar38,auVar168);
  auVar35 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar36 = vmulps_avx512vl(auVar54,auVar79._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar53,auVar79._0_16_);
  auVar44 = vxorps_avx512vl(auVar43,auVar43);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar52,auVar36);
  auVar42 = vaddps_avx512vl(auVar51,auVar44);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar52,auVar63);
  auVar45 = vfnmadd231ps_avx512vl(auVar36,auVar51,auVar63);
  auVar36 = vmulps_avx512vl(auVar35,auVar79._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar57,auVar79._0_16_);
  auVar44 = vxorps_avx512vl(auVar41,auVar41);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar56,auVar36);
  auVar43 = vaddps_avx512vl(auVar55,auVar44);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar56,auVar63);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar55,auVar63);
  auVar44 = vxorps_avx512vl(auVar44,auVar44);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar53,auVar54);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar52,auVar79._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar44,auVar51,auVar79._0_16_);
  auVar44 = vmulps_avx512vl(auVar54,auVar63);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar63,auVar53);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar52);
  auVar51 = vfnmadd231ps_avx512vl(auVar44,auVar79._0_16_,auVar51);
  auVar44 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar57,auVar35);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar56,auVar79._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar44,auVar55,auVar79._0_16_);
  auVar35 = vmulps_avx512vl(auVar35,auVar63);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar63,auVar57);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar79._0_16_,auVar56);
  auVar53 = vfnmadd231ps_avx512vl(auVar35,auVar79._0_16_,auVar55);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar44 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  fVar215 = auVar45._0_4_;
  auVar248._0_4_ = fVar215 * auVar44._0_4_;
  fVar225 = auVar45._4_4_;
  auVar248._4_4_ = fVar225 * auVar44._4_4_;
  fVar226 = auVar45._8_4_;
  auVar248._8_4_ = fVar226 * auVar44._8_4_;
  fVar135 = auVar45._12_4_;
  auVar248._12_4_ = fVar135 * auVar44._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar248,auVar35,auVar43);
  auVar44 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar43 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar255._0_4_ = fVar215 * auVar43._0_4_;
  auVar255._4_4_ = fVar225 * auVar43._4_4_;
  auVar255._8_4_ = fVar226 * auVar43._8_4_;
  auVar255._12_4_ = fVar135 * auVar43._12_4_;
  auVar35 = vfmsub231ps_avx512vl(auVar255,auVar35,auVar36);
  auVar43 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar36 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar35 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar35 = vmulps_avx512vl(auVar51,auVar35);
  auVar35 = vfmsub231ps_avx512vl(auVar35,auVar36,auVar52);
  auVar52 = vshufps_avx512vl(auVar35,auVar35,0xc9);
  auVar54 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar54 = vmulps_avx512vl(auVar51,auVar54);
  auVar36 = vfmsub231ps_avx512vl(auVar54,auVar36,auVar53);
  auVar53 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar67._16_16_ = auVar83._16_16_;
  auVar67._0_16_ = auVar79._0_16_;
  auVar66._4_28_ = auVar67._4_28_;
  auVar66._0_4_ = auVar35._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar66._0_16_);
  auVar54 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  auVar55 = vmulss_avx512f(auVar55,auVar36);
  auVar36 = vmulss_avx512f(auVar36,auVar36);
  auVar36 = vmulss_avx512f(auVar55,auVar36);
  auVar36 = vsubss_avx512f(auVar54,auVar36);
  auVar54 = vbroadcastss_avx512vl(auVar36);
  auVar55 = vmulps_avx512vl(auVar44,auVar54);
  auVar36 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar35);
  auVar43 = vmulps_avx512vl(auVar56,auVar43);
  fVar97 = auVar36._0_4_;
  auVar153._0_4_ = auVar44._0_4_ * fVar97;
  auVar153._4_4_ = auVar44._4_4_ * fVar97;
  auVar153._8_4_ = auVar44._8_4_ * fVar97;
  auVar153._12_4_ = auVar44._12_4_ * fVar97;
  auVar36 = vsubps_avx(auVar43,auVar153);
  auVar44 = vrcp14ss_avx512f(auVar79._0_16_,auVar66._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar44,ZEXT416(0x40000000));
  fVar97 = auVar44._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar105._0_4_ = fVar97 * auVar36._0_4_;
  auVar105._4_4_ = fVar97 * auVar36._4_4_;
  auVar105._8_4_ = fVar97 * auVar36._8_4_;
  auVar105._12_4_ = fVar97 * auVar36._12_4_;
  auVar44 = vmulps_avx512vl(auVar54,auVar105);
  auVar69._16_16_ = auVar83._16_16_;
  auVar69._0_16_ = auVar79._0_16_;
  auVar68._4_28_ = auVar69._4_28_;
  auVar68._0_4_ = auVar35._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar68._0_16_);
  auVar43 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar54 = vmulss_avx512f(auVar54,auVar36);
  auVar36 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  fVar230 = auVar43._0_4_ - auVar36._0_4_;
  auVar256._0_4_ = auVar52._0_4_ * fVar230;
  auVar256._4_4_ = auVar52._4_4_ * fVar230;
  auVar256._8_4_ = auVar52._8_4_ * fVar230;
  auVar256._12_4_ = auVar52._12_4_ * fVar230;
  auVar36 = vdpps_avx(auVar52,auVar53,0x7f);
  auVar43 = vbroadcastss_avx512vl(auVar35);
  auVar43 = vmulps_avx512vl(auVar43,auVar53);
  fVar97 = auVar36._0_4_;
  auVar169._0_4_ = auVar52._0_4_ * fVar97;
  auVar169._4_4_ = auVar52._4_4_ * fVar97;
  auVar169._8_4_ = auVar52._8_4_ * fVar97;
  auVar169._12_4_ = auVar52._12_4_ * fVar97;
  auVar36 = vsubps_avx(auVar43,auVar169);
  auVar43 = vrcp14ss_avx512f(auVar79._0_16_,auVar68._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar43,ZEXT416(0x40000000));
  auVar269 = ZEXT464(0x3f800000);
  fVar97 = auVar35._0_4_ * auVar43._0_4_;
  auVar43 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar52 = vmulps_avx512vl(auVar43,auVar55);
  auVar53 = vsubps_avx512vl(auVar42,auVar52);
  auVar35 = vshufps_avx(auVar45,auVar45,0xff);
  auVar35 = vmulps_avx512vl(auVar35,auVar55);
  auVar106._0_4_ = auVar35._0_4_ + auVar43._0_4_ * auVar44._0_4_;
  auVar106._4_4_ = auVar35._4_4_ + auVar43._4_4_ * auVar44._4_4_;
  auVar106._8_4_ = auVar35._8_4_ + auVar43._8_4_ * auVar44._8_4_;
  auVar106._12_4_ = auVar35._12_4_ + auVar43._12_4_ * auVar44._12_4_;
  auVar35 = vsubps_avx(auVar45,auVar106);
  auVar44 = vaddps_avx512vl(auVar42,auVar52);
  auVar43 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar233._0_4_ = auVar43._0_4_ * auVar256._0_4_;
  auVar233._4_4_ = auVar43._4_4_ * auVar256._4_4_;
  auVar233._8_4_ = auVar43._8_4_ * auVar256._8_4_;
  auVar233._12_4_ = auVar43._12_4_ * auVar256._12_4_;
  auVar52 = vsubps_avx512vl(auVar41,auVar233);
  auVar54 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar256);
  auVar154._0_4_ = auVar54._0_4_ + auVar43._0_4_ * fVar230 * auVar36._0_4_ * fVar97;
  auVar154._4_4_ = auVar54._4_4_ + auVar43._4_4_ * fVar230 * auVar36._4_4_ * fVar97;
  auVar154._8_4_ = auVar54._8_4_ + auVar43._8_4_ * fVar230 * auVar36._8_4_ * fVar97;
  auVar154._12_4_ = auVar54._12_4_ + auVar43._12_4_ * fVar230 * auVar36._12_4_ * fVar97;
  auVar36 = vsubps_avx(auVar51,auVar154);
  auVar43 = vaddps_avx512vl(auVar41,auVar233);
  auVar170._0_4_ = auVar53._0_4_ + auVar35._0_4_ * 0.33333334;
  auVar170._4_4_ = auVar53._4_4_ + auVar35._4_4_ * 0.33333334;
  auVar170._8_4_ = auVar53._8_4_ + auVar35._8_4_ * 0.33333334;
  auVar170._12_4_ = auVar53._12_4_ + auVar35._12_4_ * 0.33333334;
  auVar198._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar35 = vsubps_avx(auVar52,auVar198);
  auVar107._0_4_ = auVar44._0_4_ + (fVar215 + auVar106._0_4_) * 0.33333334;
  auVar107._4_4_ = auVar44._4_4_ + (fVar225 + auVar106._4_4_) * 0.33333334;
  auVar107._8_4_ = auVar44._8_4_ + (fVar226 + auVar106._8_4_) * 0.33333334;
  auVar107._12_4_ = auVar44._12_4_ + (fVar135 + auVar106._12_4_) * 0.33333334;
  auVar155._0_4_ = (auVar51._0_4_ + auVar154._0_4_) * 0.33333334;
  auVar155._4_4_ = (auVar51._4_4_ + auVar154._4_4_) * 0.33333334;
  auVar155._8_4_ = (auVar51._8_4_ + auVar154._8_4_) * 0.33333334;
  auVar155._12_4_ = (auVar51._12_4_ + auVar154._12_4_) * 0.33333334;
  auVar36 = vsubps_avx(auVar43,auVar155);
  auVar51 = vbroadcastss_avx512vl(auVar37);
  auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
  auVar257._0_4_ = auVar54._0_4_;
  auVar257._4_4_ = auVar257._0_4_;
  auVar257._8_4_ = auVar257._0_4_;
  auVar257._12_4_ = auVar257._0_4_;
  auVar53 = vmulps_avx512vl(auVar51,auVar53);
  auVar54 = vmulps_avx512vl(auVar51,auVar170);
  auVar35 = vmulps_avx512vl(auVar51,auVar35);
  auVar249._0_4_ = auVar51._0_4_ * auVar52._0_4_;
  auVar249._4_4_ = auVar51._4_4_ * auVar52._4_4_;
  auVar249._8_4_ = auVar51._8_4_ * auVar52._8_4_;
  auVar249._12_4_ = auVar51._12_4_ * auVar52._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar53,auVar257,auVar47);
  local_218 = vfmadd231ps_avx512vl(auVar54,auVar257,auVar180);
  local_228 = vfmadd231ps_avx512vl(auVar35,auVar257,auVar50);
  local_238 = vfmadd231ps_fma(auVar249,auVar257,auVar49);
  auVar35 = vmulps_avx512vl(auVar51,auVar44);
  auVar44 = vmulps_avx512vl(auVar51,auVar107);
  auVar36 = vmulps_avx512vl(auVar51,auVar36);
  auVar243._0_4_ = auVar51._0_4_ * auVar43._0_4_;
  auVar243._4_4_ = auVar51._4_4_ * auVar43._4_4_;
  auVar243._8_4_ = auVar51._8_4_ * auVar43._8_4_;
  auVar243._12_4_ = auVar51._12_4_ * auVar43._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar35,auVar257,auVar48);
  _local_258 = vfmadd231ps_avx512vl(auVar44,auVar257,auVar39);
  _local_268 = vfmadd231ps_avx512vl(auVar36,auVar257,auVar40);
  _local_278 = vfmadd231ps_fma(auVar243,auVar257,auVar38);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_188 = vsubps_avx512vl(local_208,auVar35);
  uVar98 = local_188._0_4_;
  auVar108._4_4_ = uVar98;
  auVar108._0_4_ = uVar98;
  auVar108._8_4_ = uVar98;
  auVar108._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_188,local_188,0x55);
  auVar44 = vshufps_avx(local_188,local_188,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar97 = pre->ray_space[k].vz.field_0.m128[0];
  fVar230 = pre->ray_space[k].vz.field_0.m128[1];
  fVar215 = pre->ray_space[k].vz.field_0.m128[2];
  fVar225 = pre->ray_space[k].vz.field_0.m128[3];
  auVar100._0_4_ = fVar97 * auVar44._0_4_;
  auVar100._4_4_ = fVar230 * auVar44._4_4_;
  auVar100._8_4_ = fVar215 * auVar44._8_4_;
  auVar100._12_4_ = fVar225 * auVar44._12_4_;
  auVar36 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar36);
  auVar48 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar108);
  local_198 = vsubps_avx512vl(local_218,auVar35);
  uVar98 = local_198._0_4_;
  auVar120._4_4_ = uVar98;
  auVar120._0_4_ = uVar98;
  auVar120._8_4_ = uVar98;
  auVar120._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_198,local_198,0x55);
  auVar44 = vshufps_avx(local_198,local_198,0xaa);
  auVar109._0_4_ = fVar97 * auVar44._0_4_;
  auVar109._4_4_ = fVar230 * auVar44._4_4_;
  auVar109._8_4_ = fVar215 * auVar44._8_4_;
  auVar109._12_4_ = fVar225 * auVar44._12_4_;
  auVar36 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar36);
  auVar49 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar120);
  local_1a8 = vsubps_avx512vl(local_228,auVar35);
  uVar98 = local_1a8._0_4_;
  auVar121._4_4_ = uVar98;
  auVar121._0_4_ = uVar98;
  auVar121._8_4_ = uVar98;
  auVar121._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar44 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar187._0_4_ = auVar44._0_4_ * fVar97;
  auVar187._4_4_ = auVar44._4_4_ * fVar230;
  auVar187._8_4_ = auVar44._8_4_ * fVar215;
  auVar187._12_4_ = auVar44._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar36);
  auVar51 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar121);
  local_1b8 = vsubps_avx(local_238,auVar35);
  uVar98 = local_1b8._0_4_;
  auVar122._4_4_ = uVar98;
  auVar122._0_4_ = uVar98;
  auVar122._8_4_ = uVar98;
  auVar122._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar44 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar199._0_4_ = auVar44._0_4_ * fVar97;
  auVar199._4_4_ = auVar44._4_4_ * fVar230;
  auVar199._8_4_ = auVar44._8_4_ * fVar215;
  auVar199._12_4_ = auVar44._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar4,auVar36);
  auVar52 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar122);
  local_1c8 = vsubps_avx512vl(_local_248,auVar35);
  uVar98 = local_1c8._0_4_;
  auVar123._4_4_ = uVar98;
  auVar123._0_4_ = uVar98;
  auVar123._8_4_ = uVar98;
  auVar123._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar44 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar210._0_4_ = auVar44._0_4_ * fVar97;
  auVar210._4_4_ = auVar44._4_4_ * fVar230;
  auVar210._8_4_ = auVar44._8_4_ * fVar215;
  auVar210._12_4_ = auVar44._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar4,auVar36);
  auVar53 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar123);
  local_1d8 = vsubps_avx512vl(_local_258,auVar35);
  uVar98 = local_1d8._0_4_;
  auVar124._4_4_ = uVar98;
  auVar124._0_4_ = uVar98;
  auVar124._8_4_ = uVar98;
  auVar124._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar44 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar216._0_4_ = auVar44._0_4_ * fVar97;
  auVar216._4_4_ = auVar44._4_4_ * fVar230;
  auVar216._8_4_ = auVar44._8_4_ * fVar215;
  auVar216._12_4_ = auVar44._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar4,auVar36);
  auVar54 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar124);
  local_1e8 = vsubps_avx512vl(_local_268,auVar35);
  uVar98 = local_1e8._0_4_;
  auVar125._4_4_ = uVar98;
  auVar125._0_4_ = uVar98;
  auVar125._8_4_ = uVar98;
  auVar125._12_4_ = uVar98;
  auVar36 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar44 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar234._0_4_ = auVar44._0_4_ * fVar97;
  auVar234._4_4_ = auVar44._4_4_ * fVar230;
  auVar234._8_4_ = auVar44._8_4_ * fVar215;
  auVar234._12_4_ = auVar44._12_4_ * fVar225;
  auVar36 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar4,auVar36);
  auVar55 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar125);
  local_1f8 = vsubps_avx(_local_278,auVar35);
  uVar98 = local_1f8._0_4_;
  auVar112._4_4_ = uVar98;
  auVar112._0_4_ = uVar98;
  auVar112._8_4_ = uVar98;
  auVar112._12_4_ = uVar98;
  auVar35 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar36 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar171._0_4_ = fVar97 * auVar36._0_4_;
  auVar171._4_4_ = fVar230 * auVar36._4_4_;
  auVar171._8_4_ = fVar215 * auVar36._8_4_;
  auVar171._12_4_ = fVar225 * auVar36._12_4_;
  auVar35 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar4,auVar35);
  auVar56 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar112);
  auVar47 = vmovlhps_avx512f(auVar48,auVar53);
  auVar44 = vmovlhps_avx(auVar49,auVar54);
  auVar43 = vmovlhps_avx(auVar51,auVar55);
  _local_348 = vmovlhps_avx(auVar52,auVar56);
  auVar36 = vminps_avx512vl(auVar47,auVar44);
  auVar50 = vmaxps_avx512vl(auVar47,auVar44);
  auVar35 = vminps_avx(auVar43,_local_348);
  auVar36 = vminps_avx(auVar36,auVar35);
  auVar35 = vmaxps_avx(auVar43,_local_348);
  auVar35 = vmaxps_avx(auVar50,auVar35);
  auVar50 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vminps_avx(auVar36,auVar50);
  auVar50 = vshufpd_avx(auVar35,auVar35,3);
  auVar35 = vmaxps_avx(auVar35,auVar50);
  auVar36 = vandps_avx512vl(auVar36,auVar268._0_16_);
  auVar35 = vandps_avx512vl(auVar35,auVar268._0_16_);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  auVar36 = vmovddup_avx512vl(auVar48);
  auVar50 = vmovddup_avx512vl(auVar49);
  auVar188._0_8_ = auVar51._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar200._0_8_ = auVar52._0_8_;
  auVar200._8_8_ = auVar200._0_8_;
  local_358 = ZEXT416((uint)(auVar35._0_4_ * 9.536743e-07));
  local_148 = vbroadcastss_avx512vl(local_358);
  auVar35 = vxorps_avx512vl(local_148._0_16_,auVar57);
  local_78 = auVar35._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  bVar27 = false;
  uVar21 = 0;
  fVar97 = *(float *)(ray + k * 4 + 0x30);
  local_158 = vsubps_avx512vl(auVar44,auVar47);
  local_168 = vsubps_avx(auVar43,auVar44);
  local_178 = vsubps_avx(_local_348,auVar43);
  local_2a8 = vsubps_avx512vl(_local_248,local_208);
  local_2b8 = vsubps_avx512vl(_local_258,local_218);
  local_2c8 = vsubps_avx512vl(_local_268,local_228);
  _local_2d8 = vsubps_avx(_local_278,local_238);
  local_2e8 = vpbroadcastd_avx512vl();
  auVar35 = ZEXT816(0x3f80000000000000);
  auVar110 = auVar35;
LAB_01b8e4cd:
  do {
    auVar48 = vshufps_avx(auVar110,auVar110,0x50);
    auVar250._8_4_ = 0x3f800000;
    auVar250._0_8_ = 0x3f8000003f800000;
    auVar250._12_4_ = 0x3f800000;
    auVar254._16_4_ = 0x3f800000;
    auVar254._0_16_ = auVar250;
    auVar254._20_4_ = 0x3f800000;
    auVar254._24_4_ = 0x3f800000;
    auVar254._28_4_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar250,auVar48);
    fVar230 = auVar48._0_4_;
    fVar135 = auVar53._0_4_;
    auVar138._0_4_ = fVar135 * fVar230;
    fVar215 = auVar48._4_4_;
    fVar141 = auVar53._4_4_;
    auVar138._4_4_ = fVar141 * fVar215;
    fVar225 = auVar48._8_4_;
    auVar138._8_4_ = fVar135 * fVar225;
    fVar226 = auVar48._12_4_;
    auVar138._12_4_ = fVar141 * fVar226;
    fVar119 = auVar54._0_4_;
    auVar156._0_4_ = fVar119 * fVar230;
    fVar132 = auVar54._4_4_;
    auVar156._4_4_ = fVar132 * fVar215;
    auVar156._8_4_ = fVar119 * fVar225;
    auVar156._12_4_ = fVar132 * fVar226;
    fVar133 = auVar55._0_4_;
    auVar172._0_4_ = fVar133 * fVar230;
    fVar134 = auVar55._4_4_;
    auVar172._4_4_ = fVar134 * fVar215;
    auVar172._8_4_ = fVar133 * fVar225;
    auVar172._12_4_ = fVar134 * fVar226;
    fVar231 = auVar56._0_4_;
    auVar113._0_4_ = fVar231 * fVar230;
    fVar242 = auVar56._4_4_;
    auVar113._4_4_ = fVar242 * fVar215;
    auVar113._8_4_ = fVar231 * fVar225;
    auVar113._12_4_ = fVar242 * fVar226;
    auVar52 = vfmadd231ps_avx512vl(auVar138,auVar49,auVar36);
    auVar57 = vfmadd231ps_avx512vl(auVar156,auVar49,auVar50);
    auVar51 = vfmadd231ps_fma(auVar172,auVar49,auVar188);
    auVar49 = vfmadd231ps_fma(auVar113,auVar200,auVar49);
    auVar48 = vmovshdup_avx(auVar35);
    fVar215 = auVar35._0_4_;
    fVar230 = (auVar48._0_4_ - fVar215) * 0.04761905;
    auVar162._4_4_ = fVar215;
    auVar162._0_4_ = fVar215;
    auVar162._8_4_ = fVar215;
    auVar162._12_4_ = fVar215;
    auVar162._16_4_ = fVar215;
    auVar162._20_4_ = fVar215;
    auVar162._24_4_ = fVar215;
    auVar162._28_4_ = fVar215;
    auVar74._0_8_ = auVar48._0_8_;
    auVar74._8_8_ = auVar74._0_8_;
    auVar74._16_8_ = auVar74._0_8_;
    auVar74._24_8_ = auVar74._0_8_;
    auVar83 = vsubps_avx(auVar74,auVar162);
    uVar98 = auVar52._0_4_;
    auVar131._4_4_ = uVar98;
    auVar131._0_4_ = uVar98;
    auVar131._8_4_ = uVar98;
    auVar131._12_4_ = uVar98;
    auVar131._16_4_ = uVar98;
    auVar131._20_4_ = uVar98;
    auVar131._24_4_ = uVar98;
    auVar131._28_4_ = uVar98;
    auVar75._8_4_ = 1;
    auVar75._0_8_ = 0x100000001;
    auVar75._12_4_ = 1;
    auVar75._16_4_ = 1;
    auVar75._20_4_ = 1;
    auVar75._24_4_ = 1;
    auVar75._28_4_ = 1;
    auVar82 = ZEXT1632(auVar52);
    auVar79 = vpermps_avx2(auVar75,auVar82);
    auVar64 = vbroadcastss_avx512vl(auVar57);
    auVar80 = ZEXT1632(auVar57);
    auVar65 = vpermps_avx512vl(auVar75,auVar80);
    auVar66 = vbroadcastss_avx512vl(auVar51);
    auVar81 = ZEXT1632(auVar51);
    auVar67 = vpermps_avx512vl(auVar75,auVar81);
    auVar68 = vbroadcastss_avx512vl(auVar49);
    auVar78 = ZEXT1632(auVar49);
    auVar69 = vpermps_avx512vl(auVar75,auVar78);
    auVar213._4_4_ = fVar230;
    auVar213._0_4_ = fVar230;
    auVar213._8_4_ = fVar230;
    auVar213._12_4_ = fVar230;
    auVar213._16_4_ = fVar230;
    auVar213._20_4_ = fVar230;
    auVar213._24_4_ = fVar230;
    auVar213._28_4_ = fVar230;
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    auVar70 = vpermps_avx512vl(auVar76,auVar82);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar72 = vpermps_avx512vl(auVar71,auVar82);
    auVar73 = vpermps_avx512vl(auVar76,auVar80);
    auVar74 = vpermps_avx512vl(auVar71,auVar80);
    auVar82 = vpermps_avx2(auVar76,auVar81);
    auVar75 = vpermps_avx512vl(auVar71,auVar81);
    auVar76 = vpermps_avx512vl(auVar76,auVar78);
    auVar77 = vpermps_avx512vl(auVar71,auVar78);
    auVar48 = vfmadd132ps_fma(auVar83,auVar162,_DAT_01faff20);
    auVar83 = vsubps_avx(auVar254,ZEXT1632(auVar48));
    auVar71 = vmulps_avx512vl(auVar64,ZEXT1632(auVar48));
    auVar80 = ZEXT1632(auVar48);
    auVar78 = vmulps_avx512vl(auVar65,auVar80);
    auVar49 = vfmadd231ps_fma(auVar71,auVar83,auVar131);
    auVar51 = vfmadd231ps_fma(auVar78,auVar83,auVar79);
    auVar71 = vmulps_avx512vl(auVar66,auVar80);
    auVar78 = vmulps_avx512vl(auVar67,auVar80);
    auVar64 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar65);
    auVar71 = vmulps_avx512vl(auVar68,auVar80);
    auVar131 = ZEXT1632(auVar48);
    auVar69 = vmulps_avx512vl(auVar69,auVar131);
    auVar66 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar67);
    fVar225 = auVar48._0_4_;
    fVar226 = auVar48._4_4_;
    auVar71._4_4_ = fVar226 * auVar64._4_4_;
    auVar71._0_4_ = fVar225 * auVar64._0_4_;
    fVar227 = auVar48._8_4_;
    auVar71._8_4_ = fVar227 * auVar64._8_4_;
    fVar228 = auVar48._12_4_;
    auVar71._12_4_ = fVar228 * auVar64._12_4_;
    auVar71._16_4_ = auVar64._16_4_ * 0.0;
    auVar71._20_4_ = auVar64._20_4_ * 0.0;
    auVar71._24_4_ = auVar64._24_4_ * 0.0;
    auVar71._28_4_ = fVar215;
    auVar78._4_4_ = fVar226 * auVar65._4_4_;
    auVar78._0_4_ = fVar225 * auVar65._0_4_;
    auVar78._8_4_ = fVar227 * auVar65._8_4_;
    auVar78._12_4_ = fVar228 * auVar65._12_4_;
    auVar78._16_4_ = auVar65._16_4_ * 0.0;
    auVar78._20_4_ = auVar65._20_4_ * 0.0;
    auVar78._24_4_ = auVar65._24_4_ * 0.0;
    auVar78._28_4_ = auVar79._28_4_;
    auVar49 = vfmadd231ps_fma(auVar71,auVar83,ZEXT1632(auVar49));
    auVar51 = vfmadd231ps_fma(auVar78,auVar83,ZEXT1632(auVar51));
    auVar84._0_4_ = fVar225 * auVar66._0_4_;
    auVar84._4_4_ = fVar226 * auVar66._4_4_;
    auVar84._8_4_ = fVar227 * auVar66._8_4_;
    auVar84._12_4_ = fVar228 * auVar66._12_4_;
    auVar84._16_4_ = auVar66._16_4_ * 0.0;
    auVar84._20_4_ = auVar66._20_4_ * 0.0;
    auVar84._24_4_ = auVar66._24_4_ * 0.0;
    auVar84._28_4_ = 0;
    auVar80._4_4_ = fVar226 * auVar67._4_4_;
    auVar80._0_4_ = fVar225 * auVar67._0_4_;
    auVar80._8_4_ = fVar227 * auVar67._8_4_;
    auVar80._12_4_ = fVar228 * auVar67._12_4_;
    auVar80._16_4_ = auVar67._16_4_ * 0.0;
    auVar80._20_4_ = auVar67._20_4_ * 0.0;
    auVar80._24_4_ = auVar67._24_4_ * 0.0;
    auVar80._28_4_ = auVar66._28_4_;
    auVar52 = vfmadd231ps_fma(auVar84,auVar83,auVar64);
    auVar57 = vfmadd231ps_fma(auVar80,auVar83,auVar65);
    auVar81._28_4_ = auVar65._28_4_;
    auVar81._0_28_ =
         ZEXT1628(CONCAT412(fVar228 * auVar57._12_4_,
                            CONCAT48(fVar227 * auVar57._8_4_,
                                     CONCAT44(fVar226 * auVar57._4_4_,fVar225 * auVar57._0_4_))));
    auVar37 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar228 * auVar52._12_4_,
                                                 CONCAT48(fVar227 * auVar52._8_4_,
                                                          CONCAT44(fVar226 * auVar52._4_4_,
                                                                   fVar225 * auVar52._0_4_)))),
                              auVar83,ZEXT1632(auVar49));
    auVar38 = vfmadd231ps_fma(auVar81,auVar83,ZEXT1632(auVar51));
    auVar79 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar49));
    auVar64 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar51));
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar65);
    auVar64 = vmulps_avx512vl(auVar64,auVar65);
    auVar209._0_4_ = fVar230 * auVar79._0_4_;
    auVar209._4_4_ = fVar230 * auVar79._4_4_;
    auVar209._8_4_ = fVar230 * auVar79._8_4_;
    auVar209._12_4_ = fVar230 * auVar79._12_4_;
    auVar209._16_4_ = fVar230 * auVar79._16_4_;
    auVar209._20_4_ = fVar230 * auVar79._20_4_;
    auVar209._24_4_ = fVar230 * auVar79._24_4_;
    auVar209._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar213,auVar64);
    auVar51 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_01feed00,ZEXT1632(auVar51));
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01feed00,ZEXT1632(auVar51));
    auVar118._0_4_ = auVar209._0_4_ + auVar37._0_4_;
    auVar118._4_4_ = auVar209._4_4_ + auVar37._4_4_;
    auVar118._8_4_ = auVar209._8_4_ + auVar37._8_4_;
    auVar118._12_4_ = auVar209._12_4_ + auVar37._12_4_;
    auVar118._16_4_ = auVar209._16_4_ + 0.0;
    auVar118._20_4_ = auVar209._20_4_ + 0.0;
    auVar118._24_4_ = auVar209._24_4_ + 0.0;
    auVar118._28_4_ = 0;
    auVar84 = ZEXT1632(auVar51);
    auVar67 = vpermt2ps_avx512vl(auVar209,_DAT_01feed00,auVar84);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar38),auVar79);
    auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar84);
    auVar79 = vsubps_avx(auVar64,auVar67);
    auVar67 = vsubps_avx512vl(auVar66,auVar69);
    auVar69 = vmulps_avx512vl(auVar73,auVar131);
    auVar71 = vmulps_avx512vl(auVar74,auVar131);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar72);
    auVar78 = vmulps_avx512vl(auVar82,auVar131);
    auVar80 = vmulps_avx512vl(auVar75,auVar131);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar73);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar74);
    auVar81 = vmulps_avx512vl(auVar76,auVar131);
    auVar70 = vmulps_avx512vl(auVar77,auVar131);
    auVar49 = vfmadd231ps_fma(auVar81,auVar83,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar75);
    auVar81 = vmulps_avx512vl(auVar131,auVar78);
    auVar72 = ZEXT1632(auVar48);
    auVar70 = vmulps_avx512vl(auVar72,auVar80);
    auVar69 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar69);
    auVar71 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar71);
    auVar82 = vmulps_avx512vl(auVar72,auVar82);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar228 * auVar49._12_4_,
                                            CONCAT48(fVar227 * auVar49._8_4_,
                                                     CONCAT44(fVar226 * auVar49._4_4_,
                                                              fVar225 * auVar49._0_4_)))),auVar83,
                         auVar78);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar80);
    auVar70._4_4_ = fVar226 * auVar78._4_4_;
    auVar70._0_4_ = fVar225 * auVar78._0_4_;
    auVar70._8_4_ = fVar227 * auVar78._8_4_;
    auVar70._12_4_ = fVar228 * auVar78._12_4_;
    auVar70._16_4_ = auVar78._16_4_ * 0.0;
    auVar70._20_4_ = auVar78._20_4_ * 0.0;
    auVar70._24_4_ = auVar78._24_4_ * 0.0;
    auVar70._28_4_ = auVar75._28_4_;
    auVar80 = vmulps_avx512vl(auVar72,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar69);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar83);
    auVar83 = vsubps_avx512vl(auVar78,auVar69);
    auVar82 = vsubps_avx512vl(auVar82,auVar71);
    auVar83 = vmulps_avx512vl(auVar83,auVar65);
    auVar82 = vmulps_avx512vl(auVar82,auVar65);
    fVar215 = fVar230 * auVar83._0_4_;
    fVar225 = fVar230 * auVar83._4_4_;
    auVar72._4_4_ = fVar225;
    auVar72._0_4_ = fVar215;
    fVar226 = fVar230 * auVar83._8_4_;
    auVar72._8_4_ = fVar226;
    fVar227 = fVar230 * auVar83._12_4_;
    auVar72._12_4_ = fVar227;
    fVar228 = fVar230 * auVar83._16_4_;
    auVar72._16_4_ = fVar228;
    fVar229 = fVar230 * auVar83._20_4_;
    auVar72._20_4_ = fVar229;
    fVar230 = fVar230 * auVar83._24_4_;
    auVar72._24_4_ = fVar230;
    auVar72._28_4_ = auVar83._28_4_;
    auVar82 = vmulps_avx512vl(auVar213,auVar82);
    auVar65 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar84);
    auVar69 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar84);
    auVar214._0_4_ = auVar81._0_4_ + fVar215;
    auVar214._4_4_ = auVar81._4_4_ + fVar225;
    auVar214._8_4_ = auVar81._8_4_ + fVar226;
    auVar214._12_4_ = auVar81._12_4_ + fVar227;
    auVar214._16_4_ = auVar81._16_4_ + fVar228;
    auVar214._20_4_ = auVar81._20_4_ + fVar229;
    auVar214._24_4_ = auVar81._24_4_ + fVar230;
    auVar214._28_4_ = auVar81._28_4_ + auVar83._28_4_;
    auVar83 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,ZEXT1632(auVar51));
    auVar71 = vaddps_avx512vl(auVar80,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,ZEXT1632(auVar51));
    auVar83 = vsubps_avx(auVar65,auVar83);
    auVar82 = vsubps_avx512vl(auVar69,auVar82);
    in_ZMM17 = ZEXT3264(auVar82);
    auVar131 = ZEXT1632(auVar37);
    auVar78 = vsubps_avx512vl(auVar81,auVar131);
    auVar162 = ZEXT1632(auVar38);
    auVar70 = vsubps_avx512vl(auVar80,auVar162);
    auVar72 = vsubps_avx512vl(auVar65,auVar64);
    auVar78 = vaddps_avx512vl(auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar69,auVar66);
    auVar70 = vaddps_avx512vl(auVar70,auVar72);
    auVar72 = vmulps_avx512vl(auVar162,auVar78);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar131,auVar70);
    auVar73 = vmulps_avx512vl(auVar68,auVar78);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar118,auVar70);
    auVar74 = vmulps_avx512vl(auVar67,auVar78);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar70);
    auVar75 = vmulps_avx512vl(auVar66,auVar78);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar64,auVar70);
    auVar76 = vmulps_avx512vl(auVar80,auVar78);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar81,auVar70);
    auVar77 = vmulps_avx512vl(auVar71,auVar78);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar214,auVar70);
    auVar84 = vmulps_avx512vl(auVar82,auVar78);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar83,auVar70);
    auVar78 = vmulps_avx512vl(auVar69,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar70);
    auVar70 = vminps_avx512vl(auVar72,auVar73);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar74,auVar75);
    auVar70 = vminps_avx512vl(auVar70,auVar73);
    auVar73 = vmaxps_avx512vl(auVar74,auVar75);
    auVar72 = vmaxps_avx512vl(auVar72,auVar73);
    auVar73 = vminps_avx512vl(auVar76,auVar77);
    auVar74 = vmaxps_avx512vl(auVar76,auVar77);
    auVar75 = vminps_avx512vl(auVar84,auVar78);
    auVar73 = vminps_avx512vl(auVar73,auVar75);
    auVar70 = vminps_avx512vl(auVar70,auVar73);
    auVar78 = vmaxps_avx512vl(auVar84,auVar78);
    auVar78 = vmaxps_avx512vl(auVar74,auVar78);
    auVar78 = vmaxps_avx512vl(auVar72,auVar78);
    uVar13 = vcmpps_avx512vl(auVar70,local_148,2);
    auVar73._4_4_ = uStack_74;
    auVar73._0_4_ = local_78;
    auVar73._8_4_ = uStack_70;
    auVar73._12_4_ = uStack_6c;
    auVar73._16_4_ = uStack_68;
    auVar73._20_4_ = uStack_64;
    auVar73._24_4_ = uStack_60;
    auVar73._28_4_ = uStack_5c;
    uVar14 = vcmpps_avx512vl(auVar78,auVar73,5);
    bVar19 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar19 == 0) {
      auVar35 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar83._16_16_ = DAT_01feed20._16_16_;
    }
    else {
      auVar78 = vsubps_avx512vl(auVar64,auVar131);
      auVar70 = vsubps_avx512vl(auVar66,auVar162);
      auVar72 = vsubps_avx512vl(auVar65,auVar81);
      auVar78 = vaddps_avx512vl(auVar78,auVar72);
      auVar72 = vsubps_avx512vl(auVar69,auVar80);
      auVar70 = vaddps_avx512vl(auVar70,auVar72);
      auVar72 = vmulps_avx512vl(auVar162,auVar78);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar131);
      auVar68 = vmulps_avx512vl(auVar68,auVar78);
      auVar68 = vfnmadd213ps_avx512vl(auVar118,auVar70,auVar68);
      auVar67 = vmulps_avx512vl(auVar67,auVar78);
      auVar67 = vfnmadd213ps_avx512vl(auVar79,auVar70,auVar67);
      auVar79 = vmulps_avx512vl(auVar66,auVar78);
      auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar64);
      auVar79 = vmulps_avx512vl(auVar80,auVar78);
      auVar80 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar81);
      auVar79 = vmulps_avx512vl(auVar71,auVar78);
      auVar71 = vfnmadd213ps_avx512vl(auVar214,auVar70,auVar79);
      auVar79 = vmulps_avx512vl(auVar82,auVar78);
      auVar81 = vfnmadd213ps_avx512vl(auVar83,auVar70,auVar79);
      auVar83 = vmulps_avx512vl(auVar69,auVar78);
      auVar69 = vfnmadd231ps_avx512vl(auVar83,auVar65,auVar70);
      auVar79 = vminps_avx(auVar72,auVar68);
      auVar83 = vmaxps_avx(auVar72,auVar68);
      auVar64 = vminps_avx(auVar67,auVar66);
      auVar64 = vminps_avx(auVar79,auVar64);
      auVar79 = vmaxps_avx(auVar67,auVar66);
      auVar83 = vmaxps_avx(auVar83,auVar79);
      auVar82 = vminps_avx(auVar80,auVar71);
      auVar79 = vmaxps_avx(auVar80,auVar71);
      auVar65 = vminps_avx(auVar81,auVar69);
      auVar82 = vminps_avx(auVar82,auVar65);
      auVar82 = vminps_avx(auVar64,auVar82);
      auVar64 = vmaxps_avx(auVar81,auVar69);
      auVar79 = vmaxps_avx(auVar79,auVar64);
      auVar83 = vmaxps_avx(auVar83,auVar79);
      uVar13 = vcmpps_avx512vl(auVar83,auVar73,5);
      uVar14 = vcmpps_avx512vl(auVar82,local_148,2);
      bVar19 = bVar19 & (byte)uVar13 & (byte)uVar14;
      if (bVar19 != 0) {
        auStack_338[uVar21] = (uint)bVar19;
        uVar13 = vmovlps_avx(auVar35);
        (&uStack_128)[uVar21] = uVar13;
        uVar34 = vmovlps_avx(auVar110);
        auStack_58[uVar21] = uVar34;
        uVar21 = (ulong)((int)uVar21 + 1);
      }
      auVar35 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar83._16_16_ = auVar79._16_16_;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar267 = ZEXT1664(auVar48);
    auVar266 = ZEXT3264(_DAT_01feed20);
    in_ZMM21 = ZEXT464(0x3e2aaaab);
    auVar265 = ZEXT1664(auVar49);
    auVar264 = ZEXT3264(auVar79);
    auVar263 = ZEXT1664(auVar35);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar270 = ZEXT1664(auVar35);
LAB_01b8ea33:
    do {
      do {
        do {
          auVar48 = auVar263._0_16_;
          auVar49 = auVar267._0_16_;
          if ((int)uVar21 == 0) {
            if (bVar27 != false) {
              return bVar27;
            }
            uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar18._4_4_ = uVar98;
            auVar18._0_4_ = uVar98;
            auVar18._8_4_ = uVar98;
            auVar18._12_4_ = uVar98;
            uVar13 = vcmpps_avx512vl(local_288,auVar18,2);
            uVar28 = (uint)uVar33 & (uint)uVar33 + 0xf & (uint)uVar13;
            uVar33 = (ulong)uVar28;
            if (uVar28 == 0) {
              return false;
            }
            goto LAB_01b8d9d9;
          }
          uVar20 = (int)uVar21 - 1;
          uVar22 = (ulong)uVar20;
          uVar6 = auStack_338[uVar22];
          auVar110._8_8_ = 0;
          auVar110._0_8_ = auStack_58[uVar22];
          uVar34 = 0;
          for (uVar26 = (ulong)uVar6; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
          {
            uVar34 = uVar34 + 1;
          }
          uVar24 = uVar6 - 1 & uVar6;
          bVar31 = uVar24 == 0;
          auStack_338[uVar22] = uVar24;
          if (bVar31) {
            uVar21 = (ulong)uVar20;
          }
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar34;
          auVar35 = vpunpcklqdq_avx(auVar101,ZEXT416((int)uVar34 + 1));
          auVar35 = vcvtqq2ps_avx512vl(auVar35);
          auVar35 = vmulps_avx512vl(auVar35,auVar265._0_16_);
          uVar98 = *(undefined4 *)((long)&uStack_128 + uVar22 * 8 + 4);
          auVar15._4_4_ = uVar98;
          auVar15._0_4_ = uVar98;
          auVar15._8_4_ = uVar98;
          auVar15._12_4_ = uVar98;
          auVar51 = vmulps_avx512vl(auVar35,auVar15);
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = 0x3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar35 = vsubps_avx(auVar126,auVar35);
          uVar98 = *(undefined4 *)(&uStack_128 + uVar22);
          auVar16._4_4_ = uVar98;
          auVar16._0_4_ = uVar98;
          auVar16._8_4_ = uVar98;
          auVar16._12_4_ = uVar98;
          auVar35 = vfmadd231ps_avx512vl(auVar51,auVar35,auVar16);
          auVar51 = vmovshdup_avx(auVar35);
          fVar230 = auVar51._0_4_ - auVar35._0_4_;
          auVar51 = vucomiss_avx512f(ZEXT416((uint)fVar230));
          in_ZMM21 = ZEXT1664(auVar51);
          if (uVar6 == 0 || bVar31) goto LAB_01b8e4cd;
          auVar51 = vshufps_avx(auVar110,auVar110,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar230));
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar139,auVar51);
          fVar215 = auVar51._0_4_;
          auVar157._0_4_ = fVar215 * fVar135;
          fVar225 = auVar51._4_4_;
          auVar157._4_4_ = fVar225 * fVar141;
          fVar226 = auVar51._8_4_;
          auVar157._8_4_ = fVar226 * fVar135;
          fVar227 = auVar51._12_4_;
          auVar157._12_4_ = fVar227 * fVar141;
          auVar173._0_4_ = fVar215 * fVar119;
          auVar173._4_4_ = fVar225 * fVar132;
          auVar173._8_4_ = fVar226 * fVar119;
          auVar173._12_4_ = fVar227 * fVar132;
          auVar181._0_4_ = fVar215 * fVar133;
          auVar181._4_4_ = fVar225 * fVar134;
          auVar181._8_4_ = fVar226 * fVar133;
          auVar181._12_4_ = fVar227 * fVar134;
          auVar127._0_4_ = fVar215 * fVar231;
          auVar127._4_4_ = fVar225 * fVar242;
          auVar127._8_4_ = fVar226 * fVar231;
          auVar127._12_4_ = fVar227 * fVar242;
          auVar51 = vfmadd231ps_fma(auVar157,auVar52,auVar36);
          auVar57 = vfmadd231ps_fma(auVar173,auVar52,auVar50);
          auVar37 = vfmadd231ps_fma(auVar181,auVar52,auVar188);
          auVar52 = vfmadd231ps_fma(auVar127,auVar52,auVar200);
          auVar77._16_16_ = auVar51;
          auVar77._0_16_ = auVar51;
          auVar163._16_16_ = auVar57;
          auVar163._0_16_ = auVar57;
          auVar177._16_16_ = auVar37;
          auVar177._0_16_ = auVar37;
          auVar79 = vpermps_avx512vl(auVar266._0_32_,ZEXT1632(auVar35));
          auVar83 = vsubps_avx(auVar163,auVar77);
          auVar57 = vfmadd213ps_fma(auVar83,auVar79,auVar77);
          auVar83 = vsubps_avx(auVar177,auVar163);
          auVar38 = vfmadd213ps_fma(auVar83,auVar79,auVar163);
          auVar51 = vsubps_avx(auVar52,auVar37);
          auVar164._16_16_ = auVar51;
          auVar164._0_16_ = auVar51;
          auVar51 = vfmadd213ps_fma(auVar164,auVar79,auVar177);
          auVar83 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar57));
          auVar52 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar57));
          auVar83 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar38));
          auVar51 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar38));
          auVar83 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar52));
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar83,auVar79);
          auVar83 = vmulps_avx512vl(auVar83,auVar264._0_32_);
          auVar51 = vmulss_avx512f(ZEXT416((uint)fVar230),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar215 = auVar51._0_4_;
          auVar182._0_8_ =
               CONCAT44(auVar63._4_4_ + fVar215 * auVar83._4_4_,
                        auVar63._0_4_ + fVar215 * auVar83._0_4_);
          auVar182._8_4_ = auVar63._8_4_ + fVar215 * auVar83._8_4_;
          auVar182._12_4_ = auVar63._12_4_ + fVar215 * auVar83._12_4_;
          auVar158._0_4_ = fVar215 * auVar83._16_4_;
          auVar158._4_4_ = fVar215 * auVar83._20_4_;
          auVar158._8_4_ = fVar215 * auVar83._24_4_;
          auVar158._12_4_ = fVar215 * auVar83._28_4_;
          auVar42 = vsubps_avx((undefined1  [16])0x0,auVar158);
          auVar38 = vshufpd_avx(auVar63,auVar63,3);
          auVar39 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar51 = vsubps_avx(auVar38,auVar63);
          auVar52 = vsubps_avx(auVar39,(undefined1  [16])0x0);
          auVar201._0_4_ = auVar51._0_4_ + auVar52._0_4_;
          auVar201._4_4_ = auVar51._4_4_ + auVar52._4_4_;
          auVar201._8_4_ = auVar51._8_4_ + auVar52._8_4_;
          auVar201._12_4_ = auVar51._12_4_ + auVar52._12_4_;
          auVar51 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar52 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar57 = vshufps_avx(auVar42,auVar42,0xb1);
          auVar37 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar251._4_4_ = auVar201._0_4_;
          auVar251._0_4_ = auVar201._0_4_;
          auVar251._8_4_ = auVar201._0_4_;
          auVar251._12_4_ = auVar201._0_4_;
          auVar40 = vshufps_avx(auVar201,auVar201,0x55);
          fVar215 = auVar40._0_4_;
          auVar211._0_4_ = auVar51._0_4_ * fVar215;
          fVar225 = auVar40._4_4_;
          auVar211._4_4_ = auVar51._4_4_ * fVar225;
          fVar226 = auVar40._8_4_;
          auVar211._8_4_ = auVar51._8_4_ * fVar226;
          fVar227 = auVar40._12_4_;
          auVar211._12_4_ = auVar51._12_4_ * fVar227;
          auVar217._0_4_ = auVar52._0_4_ * fVar215;
          auVar217._4_4_ = auVar52._4_4_ * fVar225;
          auVar217._8_4_ = auVar52._8_4_ * fVar226;
          auVar217._12_4_ = auVar52._12_4_ * fVar227;
          auVar235._0_4_ = auVar57._0_4_ * fVar215;
          auVar235._4_4_ = auVar57._4_4_ * fVar225;
          auVar235._8_4_ = auVar57._8_4_ * fVar226;
          auVar235._12_4_ = auVar57._12_4_ * fVar227;
          auVar202._0_4_ = auVar37._0_4_ * fVar215;
          auVar202._4_4_ = auVar37._4_4_ * fVar225;
          auVar202._8_4_ = auVar37._8_4_ * fVar226;
          auVar202._12_4_ = auVar37._12_4_ * fVar227;
          auVar51 = vfmadd231ps_fma(auVar211,auVar251,auVar63);
          auVar52 = vfmadd231ps_fma(auVar217,auVar251,auVar182);
          auVar45 = vfmadd231ps_fma(auVar235,auVar251,auVar42);
          auVar46 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar251);
          auVar40 = vshufpd_avx(auVar51,auVar51,1);
          auVar41 = vshufpd_avx(auVar52,auVar52,1);
          auVar58 = vshufpd_avx512vl(auVar45,auVar45,1);
          auVar59 = vshufpd_avx512vl(auVar46,auVar46,1);
          in_ZMM17 = ZEXT1664(auVar59);
          auVar57 = vminss_avx(auVar51,auVar52);
          auVar51 = vmaxss_avx(auVar52,auVar51);
          auVar37 = vminss_avx(auVar45,auVar46);
          auVar52 = vmaxss_avx(auVar46,auVar45);
          auVar57 = vminss_avx(auVar57,auVar37);
          auVar51 = vmaxss_avx(auVar52,auVar51);
          auVar37 = vminss_avx(auVar40,auVar41);
          auVar52 = vmaxss_avx(auVar41,auVar40);
          auVar40 = vminss_avx512f(auVar58,auVar59);
          auVar41 = vmaxss_avx512f(auVar59,auVar58);
          auVar52 = vmaxss_avx(auVar41,auVar52);
          auVar37 = vminss_avx512f(auVar37,auVar40);
          vucomiss_avx512f(auVar57);
          fVar225 = auVar52._0_4_;
          fVar215 = auVar51._0_4_;
          if (4 < (uint)uVar21) {
            bVar32 = fVar225 == -0.0001;
            bVar29 = NAN(fVar225);
            if (fVar225 <= -0.0001) goto LAB_01b8ec63;
            break;
          }
LAB_01b8ec63:
          auVar40 = vucomiss_avx512f(auVar37);
          bVar32 = fVar225 <= -0.0001;
          bVar30 = -0.0001 < fVar215;
          bVar29 = bVar32;
          if (!bVar32) break;
          uVar13 = vcmpps_avx512vl(auVar57,auVar40,5);
          uVar14 = vcmpps_avx512vl(auVar37,auVar40,5);
          bVar19 = (byte)uVar13 & (byte)uVar14 & 1;
          bVar32 = bVar30 && bVar19 == 0;
          bVar29 = bVar30 && bVar19 == 0;
        } while (!bVar30 || bVar19 != 0);
        vcmpss_avx512f(auVar57,auVar48,1);
        auVar45 = auVar269._0_16_;
        uVar13 = vcmpss_avx512f(auVar51,auVar48,1);
        bVar30 = (bool)((byte)uVar13 & 1);
        auVar83._0_16_ = auVar45;
        iVar96 = auVar269._0_4_;
        auVar85._4_28_ = auVar83._4_28_;
        auVar85._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * iVar96);
        vucomiss_avx512f(auVar85._0_16_);
        bVar29 = (bool)(!bVar32 | bVar29);
        bVar30 = bVar29 == false;
        auVar87._16_16_ = auVar83._16_16_;
        auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar86._4_28_ = auVar87._4_28_;
        auVar86._0_4_ = (uint)bVar29 * auVar263._0_4_ + (uint)!bVar29 * 0x7f800000;
        auVar41 = auVar86._0_16_;
        auVar89._16_16_ = auVar83._16_16_;
        auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar29 * auVar263._0_4_ + (uint)!bVar29 * -0x800000;
        auVar40 = auVar88._0_16_;
        uVar13 = vcmpss_avx512f(auVar37,auVar48,1);
        bVar32 = (bool)((byte)uVar13 & 1);
        auVar91._16_16_ = auVar83._16_16_;
        auVar91._0_16_ = auVar45;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar96);
        auVar37 = vucomiss_avx512f(auVar90._0_16_);
        in_ZMM17 = ZEXT1664(auVar37);
        if ((bVar29) || (bVar30)) {
          auVar37 = vucomiss_avx512f(auVar57);
          if ((bVar29) || (bVar30)) {
            auVar46 = vxorps_avx512vl(auVar57,auVar270._0_16_);
            in_ZMM17 = ZEXT1664(auVar46);
            auVar57 = vsubss_avx512f(auVar37,auVar57);
            auVar57 = vdivss_avx512f(auVar46,auVar57);
            auVar37 = vsubss_avx512f(auVar45,auVar57);
            auVar57 = vfmadd213ss_avx512f(auVar37,auVar48,auVar57);
            auVar37 = auVar57;
          }
          else {
            auVar37 = vxorps_avx512vl(auVar37,auVar37);
            vucomiss_avx512f(auVar37);
            if ((bVar29) || (auVar57 = auVar45, bVar30)) {
              auVar57 = SUB6416(ZEXT464(0xff800000),0);
              auVar37 = ZEXT416(0x7f800000);
            }
          }
          auVar41 = vminss_avx512f(auVar41,auVar37);
          auVar40 = vmaxss_avx(auVar57,auVar40);
        }
        uVar13 = vcmpss_avx512f(auVar52,auVar48,1);
        bVar32 = (bool)((byte)uVar13 & 1);
        fVar226 = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar96);
        if ((auVar85._0_4_ != fVar226) || (NAN(auVar85._0_4_) || NAN(fVar226))) {
          if ((fVar225 != fVar215) || (NAN(fVar225) || NAN(fVar215))) {
            auVar51 = vxorps_avx512vl(auVar51,auVar270._0_16_);
            auVar203._0_4_ = auVar51._0_4_ / (fVar225 - fVar215);
            auVar203._4_12_ = auVar51._4_12_;
            auVar51 = vsubss_avx512f(auVar45,auVar203);
            auVar51 = vfmadd213ss_avx512f(auVar51,auVar48,auVar203);
            auVar52 = auVar51;
          }
          else if ((fVar215 != 0.0) ||
                  (auVar51 = auVar45, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar215))) {
            auVar51 = SUB6416(ZEXT464(0xff800000),0);
            auVar52 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar41 = vminss_avx(auVar41,auVar52);
          auVar40 = vmaxss_avx(auVar51,auVar40);
        }
        bVar32 = auVar90._0_4_ != fVar226;
        auVar51 = vminss_avx512f(auVar41,auVar45);
        auVar93._16_16_ = auVar83._16_16_;
        auVar93._0_16_ = auVar41;
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar32 * auVar51._0_4_ + (uint)!bVar32 * auVar41._0_4_;
        auVar51 = vmaxss_avx512f(auVar45,auVar40);
        auVar95._16_16_ = auVar83._16_16_;
        auVar95._0_16_ = auVar40;
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (uint)bVar32 * auVar51._0_4_ + (uint)!bVar32 * auVar40._0_4_;
        auVar51 = vmaxss_avx512f(auVar48,auVar92._0_16_);
        auVar52 = vminss_avx512f(auVar94._0_16_,auVar45);
      } while (auVar52._0_4_ < auVar51._0_4_);
      auVar46 = vmaxss_avx512f(auVar48,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
      auVar59 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar45);
      auVar128._0_8_ = auVar63._0_8_;
      auVar128._8_8_ = auVar128._0_8_;
      auVar218._8_8_ = auVar182._0_8_;
      auVar218._0_8_ = auVar182._0_8_;
      auVar236._8_8_ = auVar42._0_8_;
      auVar236._0_8_ = auVar42._0_8_;
      auVar51 = vshufpd_avx(auVar182,auVar182,3);
      auVar52 = vshufpd_avx(auVar42,auVar42,3);
      auVar57 = vshufps_avx(auVar46,auVar59,0);
      auVar252._8_4_ = 0x3f800000;
      auVar252._0_8_ = 0x3f8000003f800000;
      auVar252._12_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar252,auVar57);
      fVar215 = auVar57._0_4_;
      auVar174._0_4_ = fVar215 * auVar38._0_4_;
      fVar225 = auVar57._4_4_;
      auVar174._4_4_ = fVar225 * auVar38._4_4_;
      fVar226 = auVar57._8_4_;
      auVar174._8_4_ = fVar226 * auVar38._8_4_;
      fVar227 = auVar57._12_4_;
      auVar174._12_4_ = fVar227 * auVar38._12_4_;
      auVar183._0_4_ = fVar215 * auVar51._0_4_;
      auVar183._4_4_ = fVar225 * auVar51._4_4_;
      auVar183._8_4_ = fVar226 * auVar51._8_4_;
      auVar183._12_4_ = fVar227 * auVar51._12_4_;
      auVar258._0_4_ = auVar52._0_4_ * fVar215;
      auVar258._4_4_ = auVar52._4_4_ * fVar225;
      auVar258._8_4_ = auVar52._8_4_ * fVar226;
      auVar258._12_4_ = auVar52._12_4_ * fVar227;
      auVar159._0_4_ = fVar215 * auVar39._0_4_;
      auVar159._4_4_ = fVar225 * auVar39._4_4_;
      auVar159._8_4_ = fVar226 * auVar39._8_4_;
      auVar159._12_4_ = fVar227 * auVar39._12_4_;
      auVar38 = vfmadd231ps_fma(auVar174,auVar37,auVar128);
      auVar39 = vfmadd231ps_fma(auVar183,auVar37,auVar218);
      auVar40 = vfmadd231ps_fma(auVar258,auVar37,auVar236);
      auVar41 = vfmadd231ps_fma(auVar159,auVar37,ZEXT816(0));
      auVar52 = vsubss_avx512f(auVar45,auVar46);
      auVar51 = vmovshdup_avx(auVar110);
      auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar46._0_4_)),auVar110,auVar52);
      auVar52 = vsubss_avx512f(auVar45,auVar59);
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar59._0_4_)),auVar110,auVar52);
      auVar42 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar230));
      auVar51 = vsubps_avx(auVar39,auVar38);
      auVar57 = vmulps_avx512vl(auVar51,auVar49);
      auVar51 = vsubps_avx(auVar40,auVar39);
      auVar37 = vmulps_avx512vl(auVar51,auVar49);
      auVar51 = vsubps_avx(auVar41,auVar40);
      auVar51 = vmulps_avx512vl(auVar51,auVar49);
      auVar52 = vminps_avx(auVar37,auVar51);
      auVar51 = vmaxps_avx(auVar37,auVar51);
      auVar52 = vminps_avx(auVar57,auVar52);
      auVar51 = vmaxps_avx(auVar57,auVar51);
      auVar57 = vshufpd_avx(auVar52,auVar52,3);
      auVar37 = vshufpd_avx(auVar51,auVar51,3);
      auVar52 = vminps_avx(auVar52,auVar57);
      auVar51 = vmaxps_avx(auVar51,auVar37);
      fVar230 = auVar42._0_4_;
      auVar204._0_4_ = auVar52._0_4_ * fVar230;
      auVar204._4_4_ = auVar52._4_4_ * fVar230;
      auVar204._8_4_ = auVar52._8_4_ * fVar230;
      auVar204._12_4_ = auVar52._12_4_ * fVar230;
      auVar189._0_4_ = fVar230 * auVar51._0_4_;
      auVar189._4_4_ = fVar230 * auVar51._4_4_;
      auVar189._8_4_ = fVar230 * auVar51._8_4_;
      auVar189._12_4_ = fVar230 * auVar51._12_4_;
      auVar42 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar59._0_4_ - auVar58._0_4_)));
      auVar51 = vshufpd_avx(auVar38,auVar38,3);
      auVar52 = vshufpd_avx(auVar39,auVar39,3);
      auVar57 = vshufpd_avx(auVar40,auVar40,3);
      auVar37 = vshufpd_avx(auVar41,auVar41,3);
      auVar51 = vsubps_avx(auVar51,auVar38);
      auVar38 = vsubps_avx(auVar52,auVar39);
      auVar39 = vsubps_avx(auVar57,auVar40);
      auVar37 = vsubps_avx(auVar37,auVar41);
      auVar52 = vminps_avx(auVar51,auVar38);
      auVar51 = vmaxps_avx(auVar51,auVar38);
      auVar57 = vminps_avx(auVar39,auVar37);
      auVar57 = vminps_avx(auVar52,auVar57);
      auVar52 = vmaxps_avx(auVar39,auVar37);
      auVar51 = vmaxps_avx(auVar51,auVar52);
      fVar230 = auVar42._0_4_;
      auVar237._0_4_ = fVar230 * auVar57._0_4_;
      auVar237._4_4_ = fVar230 * auVar57._4_4_;
      auVar237._8_4_ = fVar230 * auVar57._8_4_;
      auVar237._12_4_ = fVar230 * auVar57._12_4_;
      auVar219._0_4_ = fVar230 * auVar51._0_4_;
      auVar219._4_4_ = fVar230 * auVar51._4_4_;
      auVar219._8_4_ = fVar230 * auVar51._8_4_;
      auVar219._12_4_ = fVar230 * auVar51._12_4_;
      auVar37 = vinsertps_avx(auVar35,auVar58,0x10);
      auVar60 = vpermt2ps_avx512vl(auVar35,_DAT_01feecd0,auVar59);
      auVar111._0_4_ = auVar37._0_4_ + auVar60._0_4_;
      auVar111._4_4_ = auVar37._4_4_ + auVar60._4_4_;
      auVar111._8_4_ = auVar37._8_4_ + auVar60._8_4_;
      auVar111._12_4_ = auVar37._12_4_ + auVar60._12_4_;
      auVar17._8_4_ = 0x3f000000;
      auVar17._0_8_ = 0x3f0000003f000000;
      auVar17._12_4_ = 0x3f000000;
      auVar42 = vmulps_avx512vl(auVar111,auVar17);
      auVar52 = vshufps_avx(auVar42,auVar42,0x54);
      uVar98 = auVar42._0_4_;
      auVar114._4_4_ = uVar98;
      auVar114._0_4_ = uVar98;
      auVar114._8_4_ = uVar98;
      auVar114._12_4_ = uVar98;
      auVar39 = vfmadd213ps_avx512vl(local_158,auVar114,auVar47);
      auVar57 = vfmadd213ps_fma(local_168,auVar114,auVar44);
      auVar38 = vfmadd213ps_fma(local_178,auVar114,auVar43);
      auVar51 = vsubps_avx(auVar57,auVar39);
      auVar39 = vfmadd213ps_fma(auVar51,auVar114,auVar39);
      auVar51 = vsubps_avx(auVar38,auVar57);
      auVar51 = vfmadd213ps_fma(auVar51,auVar114,auVar57);
      auVar51 = vsubps_avx(auVar51,auVar39);
      auVar57 = vfmadd231ps_fma(auVar39,auVar51,auVar114);
      auVar40 = vmulps_avx512vl(auVar51,auVar49);
      auVar244._8_8_ = auVar57._0_8_;
      auVar244._0_8_ = auVar57._0_8_;
      auVar51 = vshufpd_avx(auVar57,auVar57,3);
      auVar57 = vshufps_avx(auVar42,auVar42,0x55);
      auVar38 = vsubps_avx(auVar51,auVar244);
      auVar39 = vfmadd231ps_fma(auVar244,auVar57,auVar38);
      auVar259._8_8_ = auVar40._0_8_;
      auVar259._0_8_ = auVar40._0_8_;
      auVar51 = vshufpd_avx(auVar40,auVar40,3);
      auVar51 = vsubps_avx512vl(auVar51,auVar259);
      auVar51 = vfmadd213ps_avx512vl(auVar51,auVar57,auVar259);
      auVar115._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar115._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar115._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar57 = vmovshdup_avx512vl(auVar51);
      auVar260._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
      auVar260._8_4_ = auVar57._8_4_ ^ 0x80000000;
      auVar260._12_4_ = auVar57._12_4_ ^ 0x80000000;
      auVar40 = vmovshdup_avx512vl(auVar38);
      auVar41 = vpermt2ps_avx512vl(auVar260,ZEXT416(5),auVar38);
      auVar57 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar38._0_4_)),auVar51,auVar40);
      auVar38 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar115);
      auVar160._0_4_ = auVar57._0_4_;
      auVar160._4_4_ = auVar160._0_4_;
      auVar160._8_4_ = auVar160._0_4_;
      auVar160._12_4_ = auVar160._0_4_;
      auVar51 = vdivps_avx(auVar41,auVar160);
      auVar61 = vdivps_avx512vl(auVar38,auVar160);
      fVar230 = auVar39._0_4_;
      auVar57 = vshufps_avx(auVar39,auVar39,0x55);
      auVar245._0_4_ = fVar230 * auVar51._0_4_ + auVar57._0_4_ * auVar61._0_4_;
      auVar245._4_4_ = fVar230 * auVar51._4_4_ + auVar57._4_4_ * auVar61._4_4_;
      auVar245._8_4_ = fVar230 * auVar51._8_4_ + auVar57._8_4_ * auVar61._8_4_;
      auVar245._12_4_ = fVar230 * auVar51._12_4_ + auVar57._12_4_ * auVar61._12_4_;
      auVar46 = vsubps_avx(auVar52,auVar245);
      auVar57 = vmovshdup_avx(auVar51);
      auVar52 = vinsertps_avx(auVar204,auVar237,0x1c);
      auVar261._0_4_ = auVar57._0_4_ * auVar52._0_4_;
      auVar261._4_4_ = auVar57._4_4_ * auVar52._4_4_;
      auVar261._8_4_ = auVar57._8_4_ * auVar52._8_4_;
      auVar261._12_4_ = auVar57._12_4_ * auVar52._12_4_;
      auVar63 = vinsertps_avx512f(auVar189,auVar219,0x1c);
      auVar57 = vmulps_avx512vl(auVar57,auVar63);
      auVar41 = vminps_avx512vl(auVar261,auVar57);
      auVar39 = vmaxps_avx(auVar57,auVar261);
      auVar40 = vmovshdup_avx(auVar61);
      auVar57 = vinsertps_avx(auVar237,auVar204,0x4c);
      auVar238._0_4_ = auVar40._0_4_ * auVar57._0_4_;
      auVar238._4_4_ = auVar40._4_4_ * auVar57._4_4_;
      auVar238._8_4_ = auVar40._8_4_ * auVar57._8_4_;
      auVar238._12_4_ = auVar40._12_4_ * auVar57._12_4_;
      auVar38 = vinsertps_avx(auVar219,auVar189,0x4c);
      auVar220._0_4_ = auVar40._0_4_ * auVar38._0_4_;
      auVar220._4_4_ = auVar40._4_4_ * auVar38._4_4_;
      auVar220._8_4_ = auVar40._8_4_ * auVar38._8_4_;
      auVar220._12_4_ = auVar40._12_4_ * auVar38._12_4_;
      auVar40 = vminps_avx(auVar238,auVar220);
      auVar41 = vaddps_avx512vl(auVar41,auVar40);
      auVar40 = vmaxps_avx(auVar220,auVar238);
      auVar221._0_4_ = auVar39._0_4_ + auVar40._0_4_;
      auVar221._4_4_ = auVar39._4_4_ + auVar40._4_4_;
      auVar221._8_4_ = auVar39._8_4_ + auVar40._8_4_;
      auVar221._12_4_ = auVar39._12_4_ + auVar40._12_4_;
      auVar239._8_8_ = 0x3f80000000000000;
      auVar239._0_8_ = 0x3f80000000000000;
      auVar39 = vsubps_avx(auVar239,auVar221);
      auVar40 = vsubps_avx(auVar239,auVar41);
      auVar41 = vsubps_avx(auVar37,auVar42);
      auVar42 = vsubps_avx(auVar60,auVar42);
      fVar227 = auVar41._0_4_;
      auVar262._0_4_ = fVar227 * auVar39._0_4_;
      fVar228 = auVar41._4_4_;
      auVar262._4_4_ = fVar228 * auVar39._4_4_;
      fVar229 = auVar41._8_4_;
      auVar262._8_4_ = fVar229 * auVar39._8_4_;
      fVar142 = auVar41._12_4_;
      auVar262._12_4_ = fVar142 * auVar39._12_4_;
      auVar62 = vbroadcastss_avx512vl(auVar51);
      auVar52 = vmulps_avx512vl(auVar62,auVar52);
      auVar63 = vmulps_avx512vl(auVar62,auVar63);
      auVar62 = vminps_avx512vl(auVar52,auVar63);
      auVar63 = vmaxps_avx512vl(auVar63,auVar52);
      auVar52 = vbroadcastss_avx512vl(auVar61);
      auVar57 = vmulps_avx512vl(auVar52,auVar57);
      auVar52 = vmulps_avx512vl(auVar52,auVar38);
      auVar38 = vminps_avx512vl(auVar57,auVar52);
      auVar38 = vaddps_avx512vl(auVar62,auVar38);
      auVar41 = vmulps_avx512vl(auVar41,auVar40);
      in_ZMM17 = ZEXT1664(auVar41);
      fVar230 = auVar42._0_4_;
      auVar222._0_4_ = fVar230 * auVar39._0_4_;
      fVar215 = auVar42._4_4_;
      auVar222._4_4_ = fVar215 * auVar39._4_4_;
      fVar225 = auVar42._8_4_;
      auVar222._8_4_ = fVar225 * auVar39._8_4_;
      fVar226 = auVar42._12_4_;
      auVar222._12_4_ = fVar226 * auVar39._12_4_;
      auVar240._0_4_ = fVar230 * auVar40._0_4_;
      auVar240._4_4_ = fVar215 * auVar40._4_4_;
      auVar240._8_4_ = fVar225 * auVar40._8_4_;
      auVar240._12_4_ = fVar226 * auVar40._12_4_;
      auVar52 = vmaxps_avx(auVar52,auVar57);
      auVar190._0_4_ = auVar63._0_4_ + auVar52._0_4_;
      auVar190._4_4_ = auVar63._4_4_ + auVar52._4_4_;
      auVar190._8_4_ = auVar63._8_4_ + auVar52._8_4_;
      auVar190._12_4_ = auVar63._12_4_ + auVar52._12_4_;
      auVar205._8_8_ = 0x3f800000;
      auVar205._0_8_ = 0x3f800000;
      auVar52 = vsubps_avx(auVar205,auVar190);
      auVar57 = vsubps_avx512vl(auVar205,auVar38);
      auVar253._0_4_ = fVar227 * auVar52._0_4_;
      auVar253._4_4_ = fVar228 * auVar52._4_4_;
      auVar253._8_4_ = fVar229 * auVar52._8_4_;
      auVar253._12_4_ = fVar142 * auVar52._12_4_;
      auVar246._0_4_ = fVar227 * auVar57._0_4_;
      auVar246._4_4_ = fVar228 * auVar57._4_4_;
      auVar246._8_4_ = fVar229 * auVar57._8_4_;
      auVar246._12_4_ = fVar142 * auVar57._12_4_;
      auVar191._0_4_ = fVar230 * auVar52._0_4_;
      auVar191._4_4_ = fVar215 * auVar52._4_4_;
      auVar191._8_4_ = fVar225 * auVar52._8_4_;
      auVar191._12_4_ = fVar226 * auVar52._12_4_;
      auVar206._0_4_ = fVar230 * auVar57._0_4_;
      auVar206._4_4_ = fVar215 * auVar57._4_4_;
      auVar206._8_4_ = fVar225 * auVar57._8_4_;
      auVar206._12_4_ = fVar226 * auVar57._12_4_;
      auVar52 = vminps_avx(auVar253,auVar246);
      auVar57 = vminps_avx512vl(auVar191,auVar206);
      auVar38 = vminps_avx512vl(auVar52,auVar57);
      auVar52 = vmaxps_avx(auVar246,auVar253);
      auVar57 = vmaxps_avx(auVar206,auVar191);
      auVar57 = vmaxps_avx(auVar57,auVar52);
      auVar39 = vminps_avx512vl(auVar262,auVar41);
      auVar52 = vminps_avx(auVar222,auVar240);
      auVar52 = vminps_avx(auVar39,auVar52);
      auVar52 = vhaddps_avx(auVar38,auVar52);
      auVar39 = vmaxps_avx512vl(auVar41,auVar262);
      auVar38 = vmaxps_avx(auVar240,auVar222);
      auVar38 = vmaxps_avx(auVar38,auVar39);
      auVar57 = vhaddps_avx(auVar57,auVar38);
      auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
      auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
      auVar192._0_4_ = auVar52._0_4_ + auVar46._0_4_;
      auVar192._4_4_ = auVar52._4_4_ + auVar46._4_4_;
      auVar192._8_4_ = auVar52._8_4_ + auVar46._8_4_;
      auVar192._12_4_ = auVar52._12_4_ + auVar46._12_4_;
      auVar207._0_4_ = auVar57._0_4_ + auVar46._0_4_;
      auVar207._4_4_ = auVar57._4_4_ + auVar46._4_4_;
      auVar207._8_4_ = auVar57._8_4_ + auVar46._8_4_;
      auVar207._12_4_ = auVar57._12_4_ + auVar46._12_4_;
      auVar52 = vmaxps_avx(auVar37,auVar192);
      auVar57 = vminps_avx(auVar207,auVar60);
      uVar34 = vcmpps_avx512vl(auVar57,auVar52,1);
    } while ((uVar34 & 3) != 0);
    uVar34 = vcmpps_avx512vl(auVar207,auVar60,1);
    uVar13 = vcmpps_avx512vl(auVar35,auVar192,1);
    if (((ushort)uVar13 & (ushort)uVar34 & 1) == 0) {
      bVar19 = 0;
    }
    else {
      auVar52 = vmovshdup_avx(auVar192);
      bVar19 = auVar58._0_4_ < auVar52._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar21 || uVar6 != 0 && !bVar31) | bVar19) == 1) {
      lVar23 = 200;
      do {
        auVar35 = vsubss_avx512f(auVar45,auVar46);
        fVar225 = auVar35._0_4_;
        fVar230 = fVar225 * fVar225 * fVar225;
        fVar226 = auVar46._0_4_;
        fVar215 = fVar226 * 3.0 * fVar225 * fVar225;
        fVar225 = fVar225 * fVar226 * fVar226 * 3.0;
        auVar140._4_4_ = fVar230;
        auVar140._0_4_ = fVar230;
        auVar140._8_4_ = fVar230;
        auVar140._12_4_ = fVar230;
        auVar129._4_4_ = fVar215;
        auVar129._0_4_ = fVar215;
        auVar129._8_4_ = fVar215;
        auVar129._12_4_ = fVar215;
        auVar102._4_4_ = fVar225;
        auVar102._0_4_ = fVar225;
        auVar102._8_4_ = fVar225;
        auVar102._12_4_ = fVar225;
        fVar226 = fVar226 * fVar226 * fVar226;
        auVar175._0_4_ = (float)local_348._0_4_ * fVar226;
        auVar175._4_4_ = (float)local_348._4_4_ * fVar226;
        auVar175._8_4_ = fStack_340 * fVar226;
        auVar175._12_4_ = fStack_33c * fVar226;
        auVar35 = vfmadd231ps_fma(auVar175,auVar43,auVar102);
        auVar35 = vfmadd231ps_fma(auVar35,auVar44,auVar129);
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar47,auVar140);
        auVar103._8_8_ = auVar35._0_8_;
        auVar103._0_8_ = auVar35._0_8_;
        auVar35 = vshufpd_avx(auVar35,auVar35,3);
        auVar52 = vshufps_avx(auVar46,auVar46,0x55);
        auVar35 = vsubps_avx(auVar35,auVar103);
        auVar52 = vfmadd213ps_fma(auVar35,auVar52,auVar103);
        fVar230 = auVar52._0_4_;
        auVar35 = vshufps_avx(auVar52,auVar52,0x55);
        auVar104._0_4_ = auVar51._0_4_ * fVar230 + auVar61._0_4_ * auVar35._0_4_;
        auVar104._4_4_ = auVar51._4_4_ * fVar230 + auVar61._4_4_ * auVar35._4_4_;
        auVar104._8_4_ = auVar51._8_4_ * fVar230 + auVar61._8_4_ * auVar35._8_4_;
        auVar104._12_4_ = auVar51._12_4_ * fVar230 + auVar61._12_4_ * auVar35._12_4_;
        auVar46 = vsubps_avx(auVar46,auVar104);
        auVar35 = vandps_avx512vl(auVar52,auVar268._0_16_);
        auVar52 = vprolq_avx512vl(auVar35,0x20);
        auVar35 = vmaxss_avx(auVar52,auVar35);
        bVar31 = auVar35._0_4_ <= (float)local_358._0_4_;
        if (auVar35._0_4_ < (float)local_358._0_4_) {
          auVar35 = vucomiss_avx512f(auVar48);
          if (bVar31) {
            auVar51 = vucomiss_avx512f(auVar35);
            auVar269 = ZEXT1664(auVar51);
            if (bVar31) {
              vmovshdup_avx(auVar35);
              auVar51 = vucomiss_avx512f(auVar48);
              if (bVar31) {
                auVar52 = vucomiss_avx512f(auVar51);
                auVar269 = ZEXT1664(auVar52);
                if (bVar31) {
                  auVar57 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar45 = vinsertps_avx(auVar57,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar57 = vdpps_avx(auVar45,local_188,0x7f);
                  auVar37 = vdpps_avx(auVar45,local_198,0x7f);
                  auVar38 = vdpps_avx(auVar45,local_1a8,0x7f);
                  auVar39 = vdpps_avx(auVar45,local_1b8,0x7f);
                  auVar40 = vdpps_avx(auVar45,local_1c8,0x7f);
                  auVar41 = vdpps_avx(auVar45,local_1d8,0x7f);
                  auVar42 = vdpps_avx(auVar45,local_1e8,0x7f);
                  auVar45 = vdpps_avx(auVar45,local_1f8,0x7f);
                  auVar46 = vsubss_avx512f(auVar52,auVar51);
                  fVar230 = auVar51._0_4_;
                  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar40._0_4_)),auVar46,auVar57
                                           );
                  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar230)),auVar46,auVar37
                                           );
                  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar230)),auVar46,auVar38
                                           );
                  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar45._0_4_)),auVar46,auVar39
                                           );
                  auVar52 = vsubss_avx512f(auVar52,auVar35);
                  auVar184._0_4_ = auVar52._0_4_;
                  fVar230 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
                  local_d8 = auVar35._0_4_;
                  fVar215 = local_d8 * 3.0 * auVar184._0_4_ * auVar184._0_4_;
                  fVar225 = auVar184._0_4_ * local_d8 * local_d8 * 3.0;
                  fVar227 = local_d8 * local_d8 * local_d8;
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar38._0_4_)),
                                            ZEXT416((uint)fVar225),auVar37);
                  auVar52 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar215),auVar57);
                  auVar51 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar230),auVar51);
                  fVar226 = auVar51._0_4_;
                  if ((fVar97 <= fVar226) &&
                     (fVar228 = *(float *)(ray + k * 4 + 0x80), fVar226 <= fVar228)) {
                    local_c8 = vshufps_avx(auVar35,auVar35,0x55);
                    auVar193._8_4_ = 0x3f800000;
                    auVar193._0_8_ = 0x3f8000003f800000;
                    auVar193._12_4_ = 0x3f800000;
                    auVar35 = vsubps_avx(auVar193,local_c8);
                    fVar229 = local_c8._0_4_;
                    auVar208._0_4_ = fVar229 * (float)local_248._0_4_;
                    fVar142 = local_c8._4_4_;
                    auVar208._4_4_ = fVar142 * (float)local_248._4_4_;
                    fVar143 = local_c8._8_4_;
                    auVar208._8_4_ = fVar143 * fStack_240;
                    fVar144 = local_c8._12_4_;
                    auVar208._12_4_ = fVar144 * fStack_23c;
                    auVar212._0_4_ = fVar229 * (float)local_258._0_4_;
                    auVar212._4_4_ = fVar142 * (float)local_258._4_4_;
                    auVar212._8_4_ = fVar143 * fStack_250;
                    auVar212._12_4_ = fVar144 * fStack_24c;
                    auVar223._0_4_ = fVar229 * (float)local_268._0_4_;
                    auVar223._4_4_ = fVar142 * (float)local_268._4_4_;
                    auVar223._8_4_ = fVar143 * fStack_260;
                    auVar223._12_4_ = fVar144 * fStack_25c;
                    auVar241._0_4_ = fVar229 * (float)local_278._0_4_;
                    auVar241._4_4_ = fVar142 * (float)local_278._4_4_;
                    auVar241._8_4_ = fVar143 * fStack_270;
                    auVar241._12_4_ = fVar144 * fStack_26c;
                    auVar51 = vfmadd231ps_fma(auVar208,auVar35,local_208);
                    auVar52 = vfmadd231ps_fma(auVar212,auVar35,local_218);
                    auVar57 = vfmadd231ps_fma(auVar223,auVar35,local_228);
                    auVar37 = vfmadd231ps_fma(auVar241,auVar35,local_238);
                    auVar35 = vsubps_avx(auVar52,auVar51);
                    auVar51 = vsubps_avx(auVar57,auVar52);
                    auVar52 = vsubps_avx(auVar37,auVar57);
                    auVar224._0_4_ = auVar51._0_4_ * local_d8;
                    auVar224._4_4_ = auVar51._4_4_ * local_d8;
                    auVar224._8_4_ = auVar51._8_4_ * local_d8;
                    auVar224._12_4_ = auVar51._12_4_ * local_d8;
                    auVar184._4_4_ = auVar184._0_4_;
                    auVar184._8_4_ = auVar184._0_4_;
                    auVar184._12_4_ = auVar184._0_4_;
                    auVar35 = vfmadd231ps_fma(auVar224,auVar184,auVar35);
                    auVar194._0_4_ = auVar52._0_4_ * local_d8;
                    auVar194._4_4_ = auVar52._4_4_ * local_d8;
                    auVar194._8_4_ = auVar52._8_4_ * local_d8;
                    auVar194._12_4_ = auVar52._12_4_ * local_d8;
                    auVar51 = vfmadd231ps_fma(auVar194,auVar184,auVar51);
                    auVar195._0_4_ = auVar51._0_4_ * local_d8;
                    auVar195._4_4_ = auVar51._4_4_ * local_d8;
                    auVar195._8_4_ = auVar51._8_4_ * local_d8;
                    auVar195._12_4_ = auVar51._12_4_ * local_d8;
                    auVar35 = vfmadd231ps_fma(auVar195,auVar184,auVar35);
                    auVar35 = vmulps_avx512vl(auVar35,auVar49);
                    pGVar7 = (context->scene->geometries).items[uVar28].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
LAB_01b8f94d:
                      bVar19 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar19 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar176._0_4_ = fVar227 * (float)local_2d8._0_4_;
                      auVar176._4_4_ = fVar227 * (float)local_2d8._4_4_;
                      auVar176._8_4_ = fVar227 * fStack_2d0;
                      auVar176._12_4_ = fVar227 * fStack_2cc;
                      auVar161._4_4_ = fVar225;
                      auVar161._0_4_ = fVar225;
                      auVar161._8_4_ = fVar225;
                      auVar161._12_4_ = fVar225;
                      auVar49 = vfmadd132ps_fma(auVar161,auVar176,local_2c8);
                      auVar130._4_4_ = fVar215;
                      auVar130._0_4_ = fVar215;
                      auVar130._8_4_ = fVar215;
                      auVar130._12_4_ = fVar215;
                      auVar49 = vfmadd132ps_fma(auVar130,auVar49,local_2b8);
                      auVar116._4_4_ = fVar230;
                      auVar116._0_4_ = fVar230;
                      auVar116._8_4_ = fVar230;
                      auVar116._12_4_ = fVar230;
                      auVar52 = vfmadd132ps_fma(auVar116,auVar49,local_2a8);
                      auVar49 = vshufps_avx(auVar52,auVar52,0xc9);
                      auVar51 = vshufps_avx(auVar35,auVar35,0xc9);
                      auVar117._0_4_ = auVar52._0_4_ * auVar51._0_4_;
                      auVar117._4_4_ = auVar52._4_4_ * auVar51._4_4_;
                      auVar117._8_4_ = auVar52._8_4_ * auVar51._8_4_;
                      auVar117._12_4_ = auVar52._12_4_ * auVar51._12_4_;
                      auVar49 = vfmsub231ps_fma(auVar117,auVar35,auVar49);
                      auVar35 = vshufps_avx(auVar49,auVar49,0x55);
                      local_f8 = vshufps_avx(auVar49,auVar49,0xaa);
                      local_e8 = auVar49._0_4_;
                      local_108[0] = (RTCHitN)auVar35[0];
                      local_108[1] = (RTCHitN)auVar35[1];
                      local_108[2] = (RTCHitN)auVar35[2];
                      local_108[3] = (RTCHitN)auVar35[3];
                      local_108[4] = (RTCHitN)auVar35[4];
                      local_108[5] = (RTCHitN)auVar35[5];
                      local_108[6] = (RTCHitN)auVar35[6];
                      local_108[7] = (RTCHitN)auVar35[7];
                      local_108[8] = (RTCHitN)auVar35[8];
                      local_108[9] = (RTCHitN)auVar35[9];
                      local_108[10] = (RTCHitN)auVar35[10];
                      local_108[0xb] = (RTCHitN)auVar35[0xb];
                      local_108[0xc] = (RTCHitN)auVar35[0xc];
                      local_108[0xd] = (RTCHitN)auVar35[0xd];
                      local_108[0xe] = (RTCHitN)auVar35[0xe];
                      local_108[0xf] = (RTCHitN)auVar35[0xf];
                      uStack_e4 = local_e8;
                      uStack_e0 = local_e8;
                      uStack_dc = local_e8;
                      fStack_d4 = local_d8;
                      fStack_d0 = local_d8;
                      fStack_cc = local_d8;
                      local_b8 = local_298._0_8_;
                      uStack_b0 = local_298._8_8_;
                      local_a8 = local_2e8;
                      vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                      uStack_94 = context->user->instID[0];
                      local_98 = uStack_94;
                      uStack_90 = uStack_94;
                      uStack_8c = uStack_94;
                      uStack_88 = context->user->instPrimID[0];
                      uStack_84 = uStack_88;
                      uStack_80 = uStack_88;
                      uStack_7c = uStack_88;
                      *(float *)(ray + k * 4 + 0x80) = fVar226;
                      local_378 = local_2f8;
                      local_328.valid = (int *)local_378;
                      local_328.geometryUserPtr = pGVar7->userPtr;
                      local_328.context = context->user;
                      local_328.ray = (RTCRayN *)ray;
                      local_328.hit = local_108;
                      local_328.N = 4;
                      if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar7->occlusionFilterN)(&local_328);
                        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar270 = ZEXT1664(auVar35);
                        auVar269 = ZEXT464(0x3f800000);
                        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar267 = ZEXT1664(auVar35);
                        auVar35 = vxorps_avx512vl(auVar48,auVar48);
                        auVar263 = ZEXT1664(auVar35);
                      }
                      auVar35 = auVar263._0_16_;
                      uVar34 = vptestmd_avx512vl(local_378,local_378);
                      auVar83._16_16_ = DAT_01feed20._16_16_;
                      if ((uVar34 & 0xf) == 0) {
                        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar268 = ZEXT1664(auVar35);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar264 = ZEXT3264(auVar79);
                        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar265 = ZEXT1664(auVar35);
                        auVar266 = ZEXT3264(_DAT_01feed20);
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if (p_Var12 == (RTCFilterFunctionN)0x0) {
                          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar268 = ZEXT1664(auVar35);
                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar264 = ZEXT3264(auVar79);
                          auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar265 = ZEXT1664(auVar35);
                          auVar266 = ZEXT3264(_DAT_01feed20);
                        }
                        else {
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar268 = ZEXT1664(auVar48);
                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar264 = ZEXT3264(auVar79);
                          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar265 = ZEXT1664(auVar48);
                          auVar266 = ZEXT3264(_DAT_01feed20);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_328);
                            auVar266 = ZEXT3264(_DAT_01feed20);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar265 = ZEXT1664(auVar48);
                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar264 = ZEXT3264(auVar83);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar270 = ZEXT1664(auVar48);
                            auVar269 = ZEXT464(0x3f800000);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar267 = ZEXT1664(auVar48);
                            auVar35 = vxorps_avx512vl(auVar35,auVar35);
                            auVar263 = ZEXT1664(auVar35);
                            auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar268 = ZEXT1664(auVar35);
                          }
                        }
                        in_ZMM21 = ZEXT464(0x3e2aaaab);
                        uVar34 = vptestmd_avx512vl(local_378,local_378);
                        uVar34 = uVar34 & 0xf;
                        auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar31 = (bool)((byte)uVar34 & 1);
                        bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar29 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar30 = SUB81(uVar34 >> 3,0);
                        *(uint *)(local_328.ray + 0x80) =
                             (uint)bVar31 * auVar35._0_4_ |
                             (uint)!bVar31 * *(int *)(local_328.ray + 0x80);
                        *(uint *)(local_328.ray + 0x84) =
                             (uint)bVar32 * auVar35._4_4_ |
                             (uint)!bVar32 * *(int *)(local_328.ray + 0x84);
                        *(uint *)(local_328.ray + 0x88) =
                             (uint)bVar29 * auVar35._8_4_ |
                             (uint)!bVar29 * *(int *)(local_328.ray + 0x88);
                        *(uint *)(local_328.ray + 0x8c) =
                             (uint)bVar30 * auVar35._12_4_ |
                             (uint)!bVar30 * *(int *)(local_328.ray + 0x8c);
                        bVar19 = 1;
                        if ((byte)uVar34 != 0) goto LAB_01b8f94f;
                      }
                      in_ZMM21 = ZEXT464(0x3e2aaaab);
                      *(float *)(ray + k * 4 + 0x80) = fVar228;
                      goto LAB_01b8f94d;
                    }
LAB_01b8f94f:
                    bVar27 = (bool)(bVar27 | bVar19);
                  }
                }
              }
            }
          }
          break;
        }
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      goto LAB_01b8ea33;
    }
    auVar110 = vinsertps_avx(auVar58,auVar59,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }